

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void output_bb_border_live_info(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  uint32_t *puVar1;
  ulong *puVar2;
  int64_t *piVar3;
  VARR_MIR_reg_t *pVVar4;
  VARR_int *pVVar5;
  live_range_t plVar6;
  MIR_insn_t pMVar7;
  ra_ctx *prVar8;
  bb_t pbVar9;
  lr_bb_t plVar10;
  FILE *__stream;
  MIR_context_t pMVar11;
  long *plVar12;
  in_edge_t peVar13;
  in_edge_t peVar14;
  byte bVar15;
  double dVar16;
  spill_el_t *psVar17;
  anon_union_8_2_0ec0d2a8_for_u aVar18;
  undefined1 auVar19 [32];
  MIR_insn_t *ppMVar20;
  MIR_insn_t tail_insn;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 uVar24;
  ulong uVar25;
  live_range_t_conflict *pplVar26;
  bb_t_conflict *ppbVar27;
  VARR_bb_t *pVVar28;
  MIR_insn_t pMVar29;
  int *piVar30;
  lr_ctx *plVar31;
  spill_cache_el_t *psVar32;
  bitmap_t pVVar33;
  spill_el_t *psVar34;
  VARR_spill_el_t *pVVar35;
  bitmap_el_t *pbVar36;
  bitmap_t pVVar37;
  ulong extraout_RAX;
  bb_t_conflict pbVar38;
  MIR_insn_t_conflict pMVar39;
  bb_t_conflict pbVar40;
  anon_union_8_2_0ec0d2a8_for_u *paVar41;
  bb_t_conflict pbVar42;
  void *pvVar43;
  bb_t pbVar44;
  bitmap_t pVVar45;
  bb_insn_t_conflict pbVar46;
  VARR_live_range_t *pVVar47;
  func_cfg_t pfVar48;
  bb_t pbVar49;
  size_t *psVar50;
  out_edge_t peVar51;
  in_edge_t_conflict peVar52;
  DLIST_LINK_in_edge_t *pDVar53;
  DLIST_in_edge_t *pDVar54;
  bb_insn_t pbVar55;
  bb_t *ppbVar56;
  int iVar57;
  bb *pbVar58;
  ulong uVar59;
  VARR_spill_cache_el_t *pVVar60;
  lr_bb_t_conflict plVar61;
  in_edge_t peVar62;
  uint uVar63;
  MIR_reg_t MVar64;
  ulong uVar65;
  ulong uVar66;
  MIR_insn_t pMVar67;
  size_t sVar68;
  gen_ctx_t pgVar69;
  char *pcVar70;
  DLIST_dead_var_t *pDVar71;
  gen_ctx_t pgVar72;
  gen_ctx_t pgVar73;
  live_range_t_conflict plVar74;
  MIR_op_t *pMVar75;
  live_range_t_conflict plVar76;
  live_range_t_conflict plVar77;
  uint uVar78;
  in_edge_t peVar79;
  bitmap_t *ppVVar80;
  lr_bb_t_conflict plVar81;
  edge_t_conflict peVar82;
  long lVar83;
  gen_ctx_t unaff_R13;
  long lVar84;
  char *pcVar85;
  spill_el_t *e2;
  bb_t_conflict bb_insn;
  MIR_reg_t *pMVar86;
  size_t sVar87;
  long lVar88;
  char *pcVar89;
  bitmap_t *ppVVar90;
  bool bVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar94 [16];
  undefined1 in_ZMM2 [64];
  int iStack_1cc;
  bb_t_conflict pbStack_1c8;
  bb_t_conflict pbStack_1c0;
  bb_t_conflict pbStack_1b8;
  DLIST_in_edge_t *pDStack_1b0;
  uint uStack_1a8;
  undefined1 auStack_1a4 [108];
  bitmap_t pVStack_138;
  in_edge_t peStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  gen_ctx_t pgStack_110;
  gen_ctx_t pgStack_108;
  bb_t_conflict pbStack_100;
  in_edge_t peStack_f8;
  bb_t_conflict pbStack_f0;
  MIR_reg_t MStack_e4;
  MIR_context_t pMStack_e0;
  bb_t_conflict pbStack_d8;
  MIR_insn_t_conflict pMStack_d0;
  bitmap_t pVStack_c8;
  bb_insn_t pbStack_c0;
  DLIST_LINK_in_edge_t *pDStack_b8;
  rewrite_data arStack_b0 [2];
  undefined1 auStack_80 [16];
  int64_t iStack_70;
  char *pcStack_68;
  out_edge_t peStack_60;
  out_edge_t peStack_58;
  gen_ctx_t pgStack_48;
  
  if (gen_ctx->lr_ctx->scan_vars_num == 0) {
    pMVar86 = (MIR_reg_t *)0x0;
LAB_0015bd7f:
    output_bitmap(gen_ctx,"  live_in:",bb->in,1,pMVar86);
    output_bitmap(gen_ctx,"  live_out:",bb->out,1,pMVar86);
    return;
  }
  pVVar4 = gen_ctx->lr_ctx->scan_var_to_var_map;
  if (pVVar4 != (VARR_MIR_reg_t *)0x0) {
    pMVar86 = pVVar4->varr;
    goto LAB_0015bd7f;
  }
  pgVar72 = gen_ctx;
  output_bb_border_live_info_cold_1();
  pgStack_108 = (gen_ctx_t)(ulong)pgVar72->curr_cfg->max_var;
  uVar63 = pgVar72->optimize_level;
  plVar31 = pgVar72->lr_ctx;
  plVar31->curr_point = 0;
  pVVar47 = plVar31->var_live_ranges;
  pgStack_48 = gen_ctx;
  if (pVVar47 == (VARR_live_range_t *)0x0) {
LAB_0015e7f8:
    auStack_1a4._92_8_ = 0x15e7fd;
    reg_alloc_cold_87();
LAB_0015e7fd:
    auStack_1a4._92_8_ = 0x15e81c;
    __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1980,"void build_live_ranges(gen_ctx_t)");
  }
  if (pVVar47->els_num != 0) goto LAB_0015e7fd;
  pbVar58 = (bb *)((long)&pgStack_108->ctx + 1);
  pgStack_110 = pgVar72;
  do {
    pVVar47 = pgVar72->lr_ctx->var_live_ranges;
    if (pVVar47->varr == (live_range_t_conflict *)0x0) goto LAB_0015e64e;
    uVar25 = pVVar47->els_num + 1;
    if (pVVar47->size < uVar25) {
      sVar87 = (uVar25 >> 1) + uVar25;
      auStack_1a4._92_8_ = 0x15be51;
      pplVar26 = (live_range_t_conflict *)realloc(pVVar47->varr,sVar87 * 8);
      pVVar47->varr = pplVar26;
      pVVar47->size = sVar87;
      pgVar72 = pgStack_110;
    }
    sVar87 = pVVar47->els_num;
    pVVar47->els_num = sVar87 + 1;
    pVVar47->varr[sVar87] = (live_range_t_conflict)0x0;
    pbVar58 = (bb *)((long)(pbVar58 + 0xffffffffffffffff) + 0xa7);
  } while (pbVar58 != (bb *)0x0);
  pbStack_100 = (bb_t_conflict)CONCAT44(pbStack_100._4_4_,uVar63);
  if (pgVar72->optimize_level != 0) {
    pVVar28 = pgVar72->data_flow_ctx->worklist;
    if ((pVVar28 == (VARR_bb_t *)0x0) || (pVVar28->varr == (bb_t_conflict *)0x0)) {
      auStack_1a4._92_8_ = 0x15e7f8;
      reg_alloc_cold_5();
      goto LAB_0015e7f8;
    }
    pVVar28->els_num = 0;
    for (pbVar38 = (pgVar72->curr_cfg->bbs).head; pbVar38 != (bb_t_conflict)0x0;
        pbVar38 = (pbVar38->bb_link).next) {
      pVVar28 = pgVar72->data_flow_ctx->worklist;
      if (pVVar28->varr == (bb_t_conflict *)0x0) {
        auStack_1a4._92_8_ = 0x15e6c3;
        reg_alloc_cold_1();
        goto LAB_0015e6c3;
      }
      uVar25 = pVVar28->els_num + 1;
      if (pVVar28->size < uVar25) {
        sVar87 = (uVar25 >> 1) + uVar25;
        auStack_1a4._92_8_ = 0x15bef6;
        ppbVar27 = (bb_t_conflict *)realloc(pVVar28->varr,sVar87 * 8);
        pVVar28->varr = ppbVar27;
        pVVar28->size = sVar87;
        pgVar72 = pgStack_110;
      }
      sVar87 = pVVar28->els_num;
      pVVar28->els_num = sVar87 + 1;
      pVVar28->varr[sVar87] = pbVar38;
    }
    if (pgVar72->optimize_level < 2) {
      pVVar28 = pgVar72->data_flow_ctx->worklist;
      if (pVVar28 == (VARR_bb_t *)0x0) goto LAB_0015e8a6;
      auStack_1a4._92_8_ = 0x15bf4d;
      qsort(pVVar28->varr,pVVar28->els_num,8,post_cmp);
      pgVar72 = pgStack_110;
    }
    pVVar28 = pgVar72->data_flow_ctx->worklist;
    if (pVVar28 != (VARR_bb_t *)0x0) {
      uVar25 = 0;
      do {
        if (pVVar28->els_num <= uVar25) goto LAB_0015c04e;
        if (pVVar28->varr == (bb_t_conflict *)0x0) goto LAB_0015e690;
        pbVar38 = pVVar28->varr[uVar25];
        pbVar55 = (pbVar38->bb_insns).head;
        if (pbVar55 != (bb_insn_t)0x0) {
          auStack_1a4._92_8_ = 0x15bf98;
          process_bb_ranges(pgVar72,pbVar38,pbVar55->insn,((pbVar38->bb_insns).tail)->insn);
          pgVar72 = pgStack_110;
        }
        uVar25 = uVar25 + 1;
        pVVar28 = pgVar72->data_flow_ctx->worklist;
      } while (pVVar28 != (VARR_bb_t *)0x0);
    }
    auStack_1a4._92_8_ = 0x15bfb4;
    reg_alloc_cold_3();
  }
  pMVar39 = (((pgVar72->curr_func_item->u).func)->insns).head;
  pMVar7 = pMVar39;
joined_r0x0015bfc3:
  tail_insn = pMVar39;
  if (tail_insn != (MIR_insn_t)0x0) {
    if (pgVar72->optimize_level == 0) {
      uVar63 = *(int *)&pMVar7->field_0x18 - 0xa7;
      pMVar67 = pMVar7;
      if ((uVar63 < 0xe) && ((0x2007U >> (uVar63 & 0x1f) & 1) != 0)) {
        pMVar67 = (MIR_insn_t)pMVar7->data;
      }
    }
    else {
      pMVar67 = (MIR_insn_t)((long)pMVar7->data + 0x30);
    }
    pMVar39 = (tail_insn->insn_link).next;
    if (pMVar39 != (MIR_insn_t)0x0) goto code_r0x0015c00b;
    goto LAB_0015c036;
  }
LAB_0015c04e:
  if ((pgVar72->debug_file != (FILE *)0x0) && (1 < pgVar72->debug_level)) {
    auStack_1a4._92_8_ = 0x15c064;
    print_all_live_ranges(pgVar72);
    pgVar72 = pgStack_110;
  }
  plVar31 = pgVar72->lr_ctx;
  pVVar45 = plVar31->points_with_born_vars;
  if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0)) {
LAB_0015e7c2:
    auStack_1a4._92_8_ = 0x15e7c7;
    reg_alloc_cold_85();
  }
  else {
    pVVar45->els_num = 0;
    pVVar45 = plVar31->points_with_dead_vars;
    if ((pVVar45 != (bitmap_t)0x0) && (pVVar45->varr != (bitmap_el_t *)0x0)) {
      pVVar45->els_num = 0;
      pVVar47 = plVar31->var_live_ranges;
      if (pVVar47 == (VARR_live_range_t *)0x0) {
LAB_0015e67c:
        auStack_1a4._92_8_ = 0x15e681;
        reg_alloc_cold_83();
LAB_0015e681:
        auStack_1a4._92_8_ = 0x15e686;
        reg_alloc_cold_9();
LAB_0015e686:
        auStack_1a4._92_8_ = 0x15e68b;
        reg_alloc_cold_8();
LAB_0015e68b:
        auStack_1a4._92_8_ = 0x15e690;
        reg_alloc_cold_25();
LAB_0015e690:
        auStack_1a4._92_8_ = 0x15e695;
        reg_alloc_cold_2();
LAB_0015e695:
        auStack_1a4._92_8_ = 0x15e69a;
        reg_alloc_cold_63();
LAB_0015e69a:
        auStack_1a4._92_8_ = 0x15e69f;
        reg_alloc_cold_21();
LAB_0015e69f:
        auStack_1a4._92_8_ = 0x15e6be;
        __assert_fail("reg > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x210e,"void split(gen_ctx_t)");
      }
      if (pVVar47->els_num != 0) {
        uVar25 = 0;
        do {
          if (pVVar47->varr == (live_range_t_conflict *)0x0) goto LAB_0015e686;
          pgVar69 = pgVar72;
          for (plVar76 = pVVar47->varr[uVar25]; pgVar72 = pgVar69,
              plVar76 != (live_range_t_conflict)0x0; plVar76 = plVar76->next) {
            uVar65 = (ulong)plVar76->start;
            if (plVar76->finish < plVar76->start) goto LAB_0015e5bf;
            pVVar45 = pgVar72->lr_ctx->points_with_born_vars;
            auStack_1a4._92_8_ = 0x15c111;
            bitmap_expand(pVVar45,uVar65 + 1);
            if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e5ba;
            pVVar45->varr[uVar65 >> 6] = pVVar45->varr[uVar65 >> 6] | 1L << (uVar65 & 0x3f);
            pVVar45 = pgVar72->lr_ctx->points_with_dead_vars;
            uVar65 = (ulong)plVar76->finish;
            auStack_1a4._92_8_ = 0x15c14a;
            bitmap_expand(pVVar45,uVar65 + 1);
            if (pVVar45 == (bitmap_t)0x0) {
              auStack_1a4._92_8_ = 0x15e5e3;
              reg_alloc_cold_6();
              goto LAB_0015e5e3;
            }
            pVVar45->varr[uVar65 >> 6] = pVVar45->varr[uVar65 >> 6] | 1L << (uVar65 & 0x3f);
            pgVar69 = pgStack_110;
            unaff_R13 = pgVar72;
          }
          plVar31 = pgVar72->lr_ctx;
          pVVar47 = plVar31->var_live_ranges;
          if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e67c;
          uVar25 = uVar25 + 1;
        } while (uVar25 < pVVar47->els_num);
      }
      pVVar5 = plVar31->point_map;
      if ((pVVar5 == (VARR_int *)0x0) || (pVVar5->varr == (int *)0x0)) goto LAB_0015e7cc;
      pVVar5->els_num = 0;
      plVar31 = pgVar72->lr_ctx;
      if (-1 < plVar31->curr_point) {
        iVar57 = -1;
        do {
          pVVar5 = plVar31->point_map;
          if (pVVar5->varr == (int *)0x0) goto LAB_0015e681;
          uVar25 = pVVar5->els_num + 1;
          if (pVVar5->size < uVar25) {
            sVar87 = (uVar25 >> 1) + uVar25;
            auStack_1a4._92_8_ = 0x15c1fe;
            piVar30 = (int *)realloc(pVVar5->varr,sVar87 * 4);
            pVVar5->varr = piVar30;
            pVVar5->size = sVar87;
            pgVar72 = pgStack_110;
          }
          sVar87 = pVVar5->els_num;
          pVVar5->els_num = sVar87 + 1;
          pVVar5->varr[sVar87] = 0;
          plVar31 = pgVar72->lr_ctx;
          iVar57 = iVar57 + 1;
        } while (iVar57 < plVar31->curr_point);
      }
      auStack_1a4._92_8_ = 0x15c242;
      pgVar69 = pgVar72;
      bitmap_ior(plVar31->points_with_born_or_dead_vars,plVar31->points_with_born_vars,
                 plVar31->points_with_dead_vars);
      plVar31 = pgVar72->lr_ctx;
      pVVar45 = plVar31->points_with_born_or_dead_vars;
      if (pVVar45 != (bitmap_t)0x0) {
        uVar25 = pVVar45->els_num;
        pbVar36 = pVVar45->varr;
        lVar84 = -1;
        pgVar72 = (gen_ctx_t)0x0;
        uVar63 = 1;
LAB_0015c273:
        uVar65 = (ulong)pgVar72 >> 6;
        bVar91 = true;
        pgVar73 = pgVar72;
        if (uVar65 < uVar25) {
LAB_0015c282:
          if ((pbVar36[uVar65] == 0) ||
             (uVar59 = pbVar36[uVar65] >> ((ulong)pgVar72 & 0x3f), uVar59 == 0)) goto LAB_0015c295;
          uVar65 = uVar59 & 1;
          pgVar69 = pgVar72;
          while (uVar65 == 0) {
            pgVar69 = (gen_ctx_t)((long)&pgVar69->ctx + 1);
            uVar65 = uVar59 & 2;
            uVar59 = uVar59 >> 1;
          }
          bVar91 = false;
          pgVar73 = (gen_ctx_t)((long)&pgVar69->ctx + 1);
        }
LAB_0015c2c8:
        if (!bVar91) {
          pVVar45 = plVar31->points_with_born_vars;
          if (pVVar45 == (bitmap_t)0x0) {
            auStack_1a4._92_8_ = 0x15e677;
            reg_alloc_cold_13();
LAB_0015e677:
            auStack_1a4._92_8_ = 0x15e67c;
            reg_alloc_cold_12();
            goto LAB_0015e67c;
          }
          if (pgVar69 < (gen_ctx_t)(pVVar45->els_num << 6)) {
            bVar91 = (pVVar45->varr[(ulong)pgVar69 >> 6] >> ((ulong)pgVar69 & 0x3f) & 1) != 0;
          }
          else {
            bVar91 = false;
          }
          pVVar45 = plVar31->points_with_dead_vars;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e677;
          uVar78 = 0;
          if (pgVar69 < (gen_ctx_t)(pVVar45->els_num << 6)) {
            uVar78 = (uint)(pVVar45->varr[(ulong)pgVar69 >> 6] >> ((ulong)pgVar69 & 0x3f)) & 1;
          }
          if (uVar78 == 0 && !bVar91) goto LAB_0015e653;
          pVVar5 = plVar31->point_map;
          if (!(bool)(uVar63 != 0 & bVar91)) {
            if (((pVVar5 != (VARR_int *)0x0) && (piVar30 = pVVar5->varr, piVar30 != (int *)0x0)) &&
               (pgVar69 < (gen_ctx_t)pVVar5->els_num)) goto LAB_0015c399;
LAB_0015e644:
            auStack_1a4._92_8_ = 0x15e649;
            reg_alloc_cold_10();
LAB_0015e649:
            auStack_1a4._92_8_ = 0x15e64e;
            reg_alloc_cold_11();
LAB_0015e64e:
            auStack_1a4._92_8_ = 0x15e653;
            reg_alloc_cold_86();
LAB_0015e653:
            auStack_1a4._92_8_ = 0x15e672;
            __assert_fail("born_p || dead_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x18e9,"void shrink_live_ranges(gen_ctx_t)");
          }
          if (((pVVar5 == (VARR_int *)0x0) || (piVar30 = pVVar5->varr, piVar30 == (int *)0x0)) ||
             ((gen_ctx_t)pVVar5->els_num <= pgVar69)) goto LAB_0015e649;
          lVar84 = lVar84 + 1;
LAB_0015c399:
          piVar30[(long)pgVar69] = (int)lVar84;
          pgVar72 = pgVar73;
          uVar63 = uVar78;
          goto LAB_0015c273;
        }
        pVVar47 = plVar31->var_live_ranges;
        if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e821;
        sVar87 = pVVar47->els_num;
        if (sVar87 == 0) {
          lVar88 = 0;
          lVar83 = 0;
        }
        else {
          pplVar26 = pVVar47->varr;
          if (pplVar26 == (live_range_t_conflict *)0x0) goto LAB_0015e83f;
          lVar83 = 0;
          lVar88 = 0;
          sVar68 = 0;
          do {
            plVar76 = pplVar26[sVar68];
            if (plVar76 != (live_range_t_conflict)0x0) {
              pVVar5 = plVar31->point_map;
              if ((pVVar5 == (VARR_int *)0x0) || (piVar30 = pVVar5->varr, piVar30 == (int *)0x0)) {
LAB_0015e5b5:
                auStack_1a4._92_8_ = 0x15e5ba;
                reg_alloc_cold_15();
LAB_0015e5ba:
                auStack_1a4._92_8_ = 0x15e5bf;
                reg_alloc_cold_7();
LAB_0015e5bf:
                auStack_1a4._92_8_ = 0x15e5de;
                __assert_fail("lr->start <= lr->finish",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x18db,"void shrink_live_ranges(gen_ctx_t)");
              }
              pgVar72 = (gen_ctx_t)pVVar5->els_num;
              plVar77 = (live_range_t_conflict)0x0;
              do {
                if (pgVar72 <= (gen_ctx_t)(long)plVar76->start) goto LAB_0015e5b5;
                plVar6 = plVar76->next;
                iVar57 = piVar30[plVar76->start];
                plVar76->start = iVar57;
                unaff_R13 = (gen_ctx_t)(long)plVar76->finish;
                if (pgVar72 <= unaff_R13) goto LAB_0015e5e3;
                uVar63 = piVar30[(long)unaff_R13];
                plVar76->finish = uVar63;
                if (plVar77 == (live_range_t_conflict)0x0) {
LAB_0015c457:
                  lVar88 = lVar88 + 1;
                  plVar77 = plVar76;
                }
                else {
                  uVar78 = plVar77->start;
                  unaff_R13 = (gen_ctx_t)(ulong)uVar78;
                  if (((uVar78 != uVar63) && (uVar78 != uVar63 + 1)) ||
                     (bVar91 = plVar76->lr_bb == (lr_bb_t_conflict)0x0,
                     unaff_R13 = (gen_ctx_t)(ulong)CONCAT31((int3)(uVar78 >> 8),bVar91),
                     (plVar77->lr_bb == (lr_bb_t_conflict)0x0) != bVar91)) goto LAB_0015c457;
                  plVar77->start = iVar57;
                  plVar77->next = plVar6;
                  plVar61 = plVar76->lr_bb;
                  while (plVar61 != (lr_bb_t_conflict)0x0) {
                    plVar10 = plVar61->next;
                    plVar61->next = plVar77->lr_bb;
                    plVar77->lr_bb = plVar61;
                    plVar76->lr_bb = plVar10;
                    plVar61 = plVar10;
                  }
                  unaff_R13 = (gen_ctx_t)plVar76->lr_bb;
                  if (unaff_R13 != (gen_ctx_t)0x0) {
                    pgVar69 = (gen_ctx_t)plVar31->free_lr_bb_list;
                    do {
                      pgVar73 = unaff_R13;
                      unaff_R13 = *(gen_ctx_t *)&pgVar73->optimize_level;
                      *(gen_ctx_t *)&pgVar73->optimize_level = pgVar69;
                      pgVar69 = pgVar73;
                    } while (unaff_R13 != (gen_ctx_t)0x0);
                    plVar31->free_lr_bb_list = (lr_bb_t_conflict)pgVar73;
                    unaff_R13 = (gen_ctx_t)0x0;
                  }
                  plVar76->next = plVar31->free_lr_list;
                  plVar31->free_lr_list = plVar76;
                }
                lVar83 = lVar83 + 1;
                plVar76 = plVar6;
              } while (plVar6 != (live_range_t)0x0);
            }
            sVar68 = sVar68 + 1;
          } while (sVar68 != sVar87);
        }
        pcVar85 = (char *)(lVar84 + 1);
        if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) && (1 < pgStack_110->debug_level)) {
          auStack_1a4._92_8_ = 0x15c51f;
          fprintf((FILE *)pgStack_110->debug_file,
                  "Compressing live range points: from %d to %ld - %ld%%\n",
                  (ulong)(uint)plVar31->curr_point,pcVar85);
          if (lVar88 != lVar83) {
            auStack_1a4._92_8_ = 0x15c55a;
            fprintf((FILE *)pgStack_110->debug_file,
                    "Compressing live ranges: from %ld to %ld - %ld%%\n",lVar83,lVar88);
          }
        }
        pgStack_110->lr_ctx->curr_point = (int)pcVar85;
        if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) && (1 < pgStack_110->debug_level)) {
          auStack_1a4._92_8_ = 0x15c58f;
          fwrite("Ranges after the compression:\n",0x1e,1,(FILE *)pgStack_110->debug_file);
          auStack_1a4._92_8_ = 0x15c599;
          print_all_live_ranges(pgStack_110);
        }
        auStack_1a4._92_8_ = 0x15c5a6;
        assign(pgStack_110);
        pgVar72 = pgStack_110;
        if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) && (1 < pgStack_110->debug_level)) {
          auStack_1a4._92_8_ = 0x15c5d8;
          fwrite("+++++++++++++Disposition after assignment:",0x2a,1,(FILE *)pgStack_110->debug_file
                );
          if ((uint)pgStack_108 < 0x22) {
LAB_0015c6be:
            pgVar72 = pgStack_110;
            auStack_1a4._92_8_ = 0x15c6d1;
            fputc(10,(FILE *)pgStack_110->debug_file);
            goto LAB_0015c6d4;
          }
          uVar25 = 0x22;
          pcVar85 = " %3u=>";
          do {
            if ((uVar25 & 7) == 0) {
              auStack_1a4._92_8_ = 0x15c616;
              fputc(10,(FILE *)pgStack_110->debug_file);
            }
            auStack_1a4._92_8_ = 0x15c62b;
            fprintf((FILE *)pgStack_110->debug_file," %3u=>",uVar25);
            pVVar47 = pgStack_110->lr_ctx->var_live_ranges;
            if (pVVar47 == (VARR_live_range_t *)0x0) {
              auStack_1a4._92_8_ = 0x15e74e;
              reg_alloc_cold_19();
LAB_0015e74e:
              auStack_1a4._92_8_ = 0x15e753;
              reg_alloc_cold_17();
              goto LAB_0015e753;
            }
            if (uVar25 < pVVar47->els_num) {
              if (pVVar47->varr != (live_range_t_conflict *)0x0) {
                if (pVVar47->varr[uVar25] == (live_range_t_conflict)0x0) goto LAB_0015c69c;
                pVVar4 = pgStack_110->ra_ctx->reg_renumber;
                if (((pVVar4 == (VARR_MIR_reg_t *)0x0) || (pVVar4->varr == (MIR_reg_t *)0x0)) ||
                   (pVVar4->els_num <= uVar25)) goto LAB_0015e74e;
                auStack_1a4._92_8_ = 0x15c69a;
                fprintf((FILE *)pgStack_110->debug_file,"%-2u",(ulong)pVVar4->varr[uVar25]);
                goto LAB_0015c6b2;
              }
              auStack_1a4._92_8_ = 0x15e7c2;
              reg_alloc_cold_18();
              goto LAB_0015e7c2;
            }
LAB_0015c69c:
            auStack_1a4._92_8_ = 0x15c6b2;
            fwrite("UA",2,1,(FILE *)pgStack_110->debug_file);
LAB_0015c6b2:
            uVar63 = (int)uVar25 + 1;
            uVar25 = (ulong)uVar63;
            if ((uint)pgStack_108 < uVar63) goto LAB_0015c6be;
          } while( true );
        }
LAB_0015c6d4:
        MStack_e4 = 5 - (pgVar72->target_ctx->keep_fp_p == '\0');
        auStack_1a4._92_8_ = 0x15c6fb;
        pMStack_e0 = (MIR_context_t)
                     _MIR_get_module_global_var_hard_regs
                               (pgVar72->ctx,pgVar72->curr_func_item->module);
        auVar92 = in_ZMM0._0_16_;
        auVar94 = in_ZMM2._0_16_;
        pgVar72 = pgStack_110;
        if (pgStack_110->optimize_level < 2) {
          pMVar39 = (((pgStack_110->curr_func_item->u).func)->insns).head;
          if (pMVar39 == (MIR_insn_t_conflict)0x0) {
LAB_0015ca4f:
            lVar84 = 0;
            lVar83 = 0;
            pbVar38 = (bb_t_conflict)0x0;
          }
          else {
            lVar83 = 0;
            pbVar38 = (bb_t_conflict)0x0;
            lVar84 = 0;
            do {
              pMVar7 = (pMVar39->insn_link).next;
              pbVar38 = (bb_t_conflict)
                        ((long)&pbVar38->index +
                        (ulong)((*(ulong *)&pMVar39->field_0x18 & 0xfffffffc) == 0));
              auStack_1a4._92_8_ = 0x15c74a;
              uVar63 = rewrite_insn(pgStack_110,pMVar39,MStack_e4,(rewrite_data *)0x0);
              auVar92 = in_ZMM0._0_16_;
              auVar94 = in_ZMM2._0_16_;
              lVar84 = lVar84 + (ulong)uVar63;
              lVar83 = lVar83 + 1;
              pMVar39 = pMVar7;
              pgVar72 = pgStack_110;
            } while (pMVar7 != (MIR_insn_t)0x0);
          }
          goto LAB_0015ca57;
        }
        pVVar45 = pgStack_110->temp_bitmap;
        peVar79 = (in_edge_t)pgStack_110->temp_bitmap2;
        prVar8 = pgStack_110->ra_ctx;
        puVar1 = &prVar8->spill_cache_age;
        *puVar1 = *puVar1 + 1;
        pVVar60 = prVar8->spill_cache;
        if ((pVVar60 == (VARR_spill_cache_el_t *)0x0) || (pVVar60->varr == (spill_cache_el_t *)0x0))
        goto LAB_0015e826;
        pVVar60->els_num = 0;
        peStack_f8 = peVar79;
        pVStack_c8 = pVVar45;
        while( true ) {
          pfVar48 = pgVar72->curr_cfg;
          if ((ulong)pfVar48->max_var < pVVar60->els_num) break;
          if (pVVar60->varr == (spill_cache_el_t *)0x0) goto LAB_0015e69a;
          uVar25 = pVVar60->els_num + 1;
          if (pVVar60->size < uVar25) {
            pcVar85 = (char *)((uVar25 >> 1) + uVar25);
            auStack_1a4._92_8_ = 0x15c7e2;
            psVar32 = (spill_cache_el_t *)realloc(pVVar60->varr,(long)pcVar85 * 8);
            pVVar60->varr = psVar32;
            pVVar60->size = (size_t)pcVar85;
            pgVar72 = pgStack_110;
            peVar79 = peStack_f8;
          }
          sVar87 = pVVar60->els_num;
          pfVar48 = (func_cfg_t)pVVar60->varr;
          pVVar60->els_num = sVar87 + 1;
          *(undefined8 *)(&pfVar48->max_var + sVar87 * 2) = 0;
          pVVar60 = pgVar72->ra_ctx->spill_cache;
          if (pVVar60 == (VARR_spill_cache_el_t *)0x0) {
            auStack_1a4._92_8_ = 0x15c822;
            reg_alloc_cold_20();
            break;
          }
        }
        auVar92 = in_ZMM0._0_16_;
        auVar94 = in_ZMM2._0_16_;
        pgVar69 = (gen_ctx_t)(pfVar48->bbs).head;
        if (pgVar69 == (gen_ctx_t)0x0) goto LAB_0015ca4f;
        lVar83 = 0;
        lVar84 = 0;
        pbVar38 = (bb_t_conflict)0x0;
LAB_0015c837:
        arStack_b0[0].live = pVStack_c8;
        auStack_1a4._92_8_ = 0x15c862;
        pgStack_108 = pgVar69;
        arStack_b0[0].bb = (bb_t_conflict)pgVar69;
        arStack_b0[0].regs_to_save = (bitmap_t)peVar79;
        bitmap_copy(pVStack_c8,pgVar69->call_used_hard_regs[1]);
        if ((peStack_f8 == (in_edge_t)0x0) || ((peStack_f8->in_link).prev == (in_edge_t)0x0))
        goto LAB_0015e68b;
        peStack_f8->src = (bb_t)0x0;
        pbVar55 = (bb_insn_t)pgStack_108->temp_bitmap2;
        while (pbVar55 != (bb_insn_t)0x0) {
          ppMVar20 = &pbVar55->insn;
          pbVar55 = (pbVar55->bb_insn_link).prev;
          pbVar38 = (bb_t_conflict)
                    ((long)&pbVar38->index +
                    (ulong)((*(ulong *)&(*ppMVar20)->field_0x18 & 0xfffffffc) == 0));
          auStack_1a4._92_8_ = 0x15c8bf;
          uVar63 = rewrite_insn(pgStack_110,*ppMVar20,MStack_e4,arStack_b0);
          lVar84 = lVar84 + (ulong)uVar63;
          lVar83 = lVar83 + 1;
        }
        pbStack_d8 = pbVar38;
        if (pVStack_c8 == (bitmap_t)0x0) goto LAB_0015e6cd;
        pVVar45 = pgStack_108->call_used_hard_regs[0];
        if (pVVar45 != (bitmap_t)0x0) {
          pcVar89 = (char *)pVStack_c8->els_num;
          pcVar85 = (char *)pVVar45->els_num;
          pVVar33 = pVStack_c8;
          pcVar70 = pcVar89;
          if (pcVar85 < pcVar89) {
            pVVar33 = pVVar45;
            pVVar45 = pVStack_c8;
            pcVar70 = pcVar85;
            pcVar85 = pcVar89;
          }
          pbVar36 = pVVar45->varr;
          auStack_1a4._92_8_ = 0x15c928;
          iVar57 = bcmp(pVVar33->varr,pbVar36,(long)pcVar70 * 8);
          MVar64 = MStack_e4;
          if (iVar57 == 0) {
            if (pcVar70 < pcVar85) {
              do {
                if (pbVar36[(long)pcVar70] != 0) goto LAB_0015e620;
                pcVar70 = pcVar70 + 1;
              } while (pcVar85 != pcVar70);
            }
            pgVar72 = (gen_ctx_t)0x0;
            do {
              auVar92 = in_ZMM0._0_16_;
              auVar94 = in_ZMM2._0_16_;
              pbVar49 = (bb_t)((ulong)pgVar72 >> 6);
              pbVar44 = peStack_f8->src;
              bVar91 = true;
              pgVar69 = pgVar72;
              if (pbVar49 < pbVar44) {
                pgVar69 = (gen_ctx_t)((long)pbVar44 << 6);
LAB_0015c975:
                pbVar9 = (&((peStack_f8->in_link).prev)->src)[(long)pbVar49];
                if ((pbVar9 == (bb_t)0x0) ||
                   (uVar25 = (ulong)pbVar9 >> ((ulong)pgVar72 & 0x3f), uVar25 == 0))
                goto LAB_0015c988;
                uVar65 = uVar25 & 1;
                unaff_R13 = pgVar72;
                while (uVar65 == 0) {
                  unaff_R13 = (gen_ctx_t)((long)&unaff_R13->ctx + 1);
                  uVar65 = uVar25 & 2;
                  uVar25 = uVar25 >> 1;
                }
                pgVar69 = (gen_ctx_t)((long)&unaff_R13->ctx + 1);
                bVar91 = false;
              }
LAB_0015c9bc:
              if (bVar91) goto LAB_0015ca3b;
              if (unaff_R13 < (gen_ctx_t)0x22) goto LAB_0015e5f2;
              pVVar45 = pgStack_108->call_used_hard_regs[3];
              if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e5ed;
              if ((pVVar45->els_num << 6 <= ((ulong)unaff_R13 & 0xffffffff)) ||
                 ((pVVar45->varr[(ulong)unaff_R13 >> 6 & 0x3ffffff] >> ((ulong)unaff_R13 & 0x3f) & 1
                  ) == 0)) {
LAB_0015e596:
                auStack_1a4._92_8_ = 0x15e5b5;
                __assert_fail("bitmap_bit_p (bb->kill, reg)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x201b,"void rewrite(gen_ctx_t)");
              }
              pMVar7 = ((DLIST_bb_insn_t *)&pgStack_108->temp_bitmap)->head->insn;
              auStack_1a4._92_8_ = 0x15ca2c;
              spill_restore_reg(pgStack_110,(MIR_reg_t)unaff_R13,MVar64,pMVar7,
                                (uint)(*(int *)&pMVar7->field_0x18 == 0xb4),0);
              pgVar72 = pgVar69;
            } while( true );
          }
          goto LAB_0015e620;
        }
        goto LAB_0015e6d2;
      }
      auStack_1a4._92_8_ = 0x15e821;
      reg_alloc_cold_81();
LAB_0015e821:
      auStack_1a4._92_8_ = 0x15e826;
      reg_alloc_cold_80();
LAB_0015e826:
      auStack_1a4._92_8_ = 0x15e82b;
      reg_alloc_cold_26();
      goto LAB_0015e82b;
    }
  }
  auStack_1a4._92_8_ = 0x15e7cc;
  reg_alloc_cold_84();
LAB_0015e7cc:
  auStack_1a4._92_8_ = 0x15e7d1;
  reg_alloc_cold_82();
LAB_0015e7d1:
  auStack_1a4._92_8_ = 0x15e7f3;
  __assert_fail("(DLIST_out_edge_t_length (&(e->dst->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->dst->in_edges))) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x20d2,"void transform_edge_to_bb_placement(gen_ctx_t)");
code_r0x0015c00b:
  if (pgVar72->optimize_level == 0) {
    uVar63 = *(int *)&pMVar39->field_0x18 - 0xa7;
    pMVar29 = pMVar39;
    if ((uVar63 < 0xe) && ((0x2007U >> (uVar63 & 0x1f) & 1) != 0)) {
      pMVar29 = (MIR_insn_t)pMVar39->data;
    }
  }
  else {
    pMVar29 = (MIR_insn_t)((long)pMVar39->data + 0x30);
  }
  if ((bb_t_conflict)pMVar67->data != (bb_t_conflict)pMVar29->data) {
LAB_0015c036:
    auStack_1a4._92_8_ = 0x15c03e;
    process_bb_ranges(pgVar72,(bb_t_conflict)pMVar67->data,pMVar7,tail_insn);
    pMVar7 = pMVar39;
    pgVar72 = pgStack_110;
  }
  goto joined_r0x0015bfc3;
LAB_0015c295:
  uVar65 = uVar65 + 1;
  pgVar72 = (gen_ctx_t)(uVar65 * 0x40);
  pgVar73 = (gen_ctx_t)(uVar25 << 6);
  if (uVar25 == uVar65) goto LAB_0015c2c8;
  goto LAB_0015c282;
LAB_0015c988:
  pbVar49 = (bb_t)((long)&pbVar49->index + 1);
  pgVar72 = (gen_ctx_t)((long)pbVar49 * 0x40);
  if (pbVar44 == pbVar49) goto LAB_0015c9bc;
  goto LAB_0015c975;
LAB_0015ca3b:
  pgVar69 = (gen_ctx_t)pgStack_108->to_free;
  pbVar38 = pbStack_d8;
  pgVar72 = pgStack_110;
  peVar79 = peStack_f8;
  if (pgVar69 == (gen_ctx_t)0x0) goto LAB_0015ca57;
  goto LAB_0015c837;
LAB_0015ccf8:
  uVar65 = (ulong)pcVar89 >> 6;
  uVar25 = pVVar45->els_num;
  bVar91 = true;
  pcVar70 = pcVar89;
  if (uVar65 < uVar25) {
    pcVar70 = (char *)(uVar25 << 6);
LAB_0015cd14:
    if ((pVVar45->varr[uVar65] == 0) ||
       (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar89 & 0x3f), uVar59 == 0)) goto LAB_0015cd27;
    uVar25 = uVar59 & 1;
    pcVar85 = pcVar89;
    while (uVar25 == 0) {
      pcVar85 = pcVar85 + 1;
      uVar25 = uVar59 & 2;
      uVar59 = uVar59 >> 1;
    }
    pcVar70 = pcVar85 + 1;
    bVar91 = false;
  }
LAB_0015cd5b:
  if (bVar91) goto LAB_0015ccde;
  if (pcVar85 < (char *)0x22) goto LAB_0015e54e;
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (pVVar35->varr == (spill_el_t *)0x0) goto LAB_0015e549;
  uVar25 = pVVar35->els_num + 1;
  if (pVVar35->size < uVar25) {
    sVar87 = (uVar25 >> 1) + uVar25;
    auStack_1a4._92_8_ = 0x15cdaf;
    psVar34 = (spill_el_t *)realloc(pVVar35->varr,sVar87 * 0x10);
    pVVar35->varr = psVar34;
    pVVar35->size = sVar87;
    peVar51 = peStack_f8;
    pgVar72 = pgStack_110;
  }
  unaff_R13 = (gen_ctx_t)
              ((ulong)unaff_R13 & 0xffffff0000000000 | (ulong)pcVar85 & 0xffffffff | 0x100000000);
  sVar87 = pVVar35->els_num;
  psVar34 = pVVar35->varr;
  pVVar35->els_num = sVar87 + 1;
  *(gen_ctx_t *)(psVar34 + sVar87) = unaff_R13;
  psVar34[sVar87].u.e = peVar51;
  pcVar89 = pcVar70;
  goto LAB_0015ccf8;
LAB_0015cd27:
  uVar65 = uVar65 + 1;
  pcVar89 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015cd5b;
  goto LAB_0015cd14;
LAB_0015ce73:
  uVar65 = uVar65 + 1;
  pcVar89 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015cea7;
  goto LAB_0015ce60;
LAB_0015cf9d:
  uVar65 = (ulong)pcVar89 >> 6;
  uVar25 = pVVar45->els_num;
  bVar91 = true;
  pcVar70 = pcVar89;
  if (uVar65 < uVar25) {
    pcVar70 = (char *)(uVar25 << 6);
LAB_0015cfbb:
    if ((pVVar45->varr[uVar65] == 0) ||
       (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar89 & 0x3f), uVar59 == 0)) goto LAB_0015cfce;
    uVar25 = uVar59 & 1;
    pcVar85 = pcVar89;
    while (uVar25 == 0) {
      pcVar85 = pcVar85 + 1;
      uVar25 = uVar59 & 2;
      uVar59 = uVar59 >> 1;
    }
    pcVar70 = pcVar85 + 1;
    bVar91 = false;
  }
LAB_0015d002:
  if (bVar91) goto LAB_0015cf83;
  if (pcVar85 < (char *)0x22) {
LAB_0015e572:
    auStack_1a4._92_8_ = 0x15e591;
    __assert_fail("nel > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x205d,"void collect_spill_els(gen_ctx_t)");
  }
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (pVVar35->varr == (spill_el_t *)0x0) {
    auStack_1a4._92_8_ = 0x15e572;
    reg_alloc_cold_32();
    goto LAB_0015e572;
  }
  uVar25 = pVVar35->els_num + 1;
  if (pVVar35->size < uVar25) {
    sVar87 = (uVar25 >> 1) + uVar25;
    auStack_1a4._92_8_ = 0x15d051;
    psVar34 = (spill_el_t *)realloc(pVVar35->varr,sVar87 * 0x10);
    pVVar35->varr = psVar34;
    pVVar35->size = sVar87;
    pgVar72 = pgStack_110;
    peVar82 = peStack_f8;
  }
  unaff_R13 = (gen_ctx_t)((ulong)unaff_R13 & 0xffffff0000000000 | (ulong)pcVar85 & 0xffffffff);
  sVar87 = pVVar35->els_num;
  psVar34 = pVVar35->varr;
  pVVar35->els_num = sVar87 + 1;
  *(gen_ctx_t *)(psVar34 + sVar87) = unaff_R13;
  psVar34[sVar87].u.e = peVar82;
  pcVar89 = pcVar70;
  goto LAB_0015cf9d;
LAB_0015cfce:
  uVar65 = uVar65 + 1;
  pcVar89 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015d002;
  goto LAB_0015cfbb;
LAB_0015d0a5:
  pVVar35 = pgVar72->ra_ctx->spill_els;
  pgStack_108 = pgVar73;
  if (pVVar35 == (VARR_spill_el_t *)0x0) {
    auStack_1a4._92_8_ = 0x15e88f;
    reg_alloc_cold_75();
LAB_0015e88f:
    auStack_1a4._92_8_ = 0x15e894;
    reg_alloc_cold_74();
LAB_0015e894:
    auStack_1a4._92_8_ = 0x15e89c;
    reg_alloc_cold_73();
LAB_0015e89c:
    auStack_1a4._92_8_ = 0x15e8a1;
    reg_alloc_cold_72();
LAB_0015e8a1:
    auStack_1a4._92_8_ = 0x15e8a6;
    reg_alloc_cold_70();
LAB_0015e8a6:
    auStack_1a4._92_8_ = 0x15e8ab;
    reg_alloc_cold_4();
LAB_0015e8ab:
    auStack_1a4._92_8_ = 0x15e8b0;
    reg_alloc_cold_57();
LAB_0015e8b0:
    auStack_1a4._92_8_ = 0x15e8b5;
    reg_alloc_cold_55();
LAB_0015e8b5:
    auStack_1a4._92_8_ = 0x15e8ba;
    reg_alloc_cold_53();
LAB_0015e8ba:
    auStack_1a4._92_8_ = 0x15e8bf;
    reg_alloc_cold_54();
LAB_0015e8bf:
    auStack_1a4._92_8_ = 0x15e8c4;
    reg_alloc_cold_56();
LAB_0015e8c4:
    auStack_1a4._92_8_ = 0x15e8e6;
    __assert_fail("first_insn->code == MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x3b9,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
  }
  pVStack_c8 = (bitmap_t)pVVar35->varr;
  auStack_1a4._92_8_ = 0x15d0dc;
  qsort(pVStack_c8,pVVar35->els_num,0x10,spill_el_sort_cmp);
  if (((FILE *)pgVar72->debug_file != (FILE *)0x0) && (1 < pgVar72->debug_level)) {
    auStack_1a4._92_8_ = 0x15d10d;
    fwrite(" Spills on edges:\n",0x12,1,(FILE *)pgVar72->debug_file);
    pVVar35 = pgStack_110->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      uVar25 = 0xffffffffffffffff;
      paVar41 = (anon_union_8_2_0ec0d2a8_for_u *)&pVStack_c8->size;
      do {
        uVar25 = uVar25 + 1;
        pgVar72 = pgStack_110;
        if (pVVar35->els_num <= uVar25) goto LAB_0015d1cd;
        if (*(char *)((long)paVar41 + -3) == '\0') {
LAB_0015e753:
          auStack_1a4._92_8_ = 0x15e772;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20f1,"void split(gen_ctx_t)");
        }
        pcVar85 = "spill";
        if (*(char *)((long)paVar41 + -4) == '\0') {
          pcVar85 = "restore";
        }
        pcVar89 = "end";
        if (*(char *)((long)paVar41 + -2) == '\0') {
          pcVar89 = "start";
        }
        auStack_1a4._100_8_ = paVar41->e->dst->index;
        auStack_1a4._92_8_ = 0x15d1ad;
        fprintf((FILE *)pgStack_110->debug_file,"  %s r%d on %s of edge bb%lu->bb%lu\n",pcVar85,
                (ulong)((spill_el_t *)(paVar41 + -1))->reg,pcVar89,paVar41->e->src->index);
        pVVar35 = pgStack_110->ra_ctx->spill_els;
        paVar41 = paVar41 + 2;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    auStack_1a4._92_8_ = 0x15d1cd;
    pgVar72 = pgStack_110;
    reg_alloc_cold_36();
  }
LAB_0015d1cd:
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e88f;
  if (pVVar35->els_num != 0) {
    pbVar44 = (pgVar72->curr_cfg->bbs).head;
    if (pbVar44 != (bb_t_conflict)0x0) {
      iVar57 = -1;
      do {
        pbVar44 = (pbVar44->bb_link).next;
        if (pbVar44 == (bb_t)0x0) break;
        bVar91 = iVar57 != 0;
        iVar57 = iVar57 + 1;
      } while (bVar91);
    }
    pVVar45 = pgVar72->temp_bitmap;
    pgVar69 = (gen_ctx_t)pVVar35->varr;
    for (; pbVar44 != (bb_t)0x0; pbVar44 = (pbVar44->bb_link).next) {
      pVVar33 = pbVar44->kill;
      if ((pVVar33 == (bitmap_t)0x0) || (pVVar33->varr == (bitmap_el_t *)0x0)) goto LAB_0015e6c8;
      pVVar33->els_num = 0;
      pVVar33 = pbVar44->gen;
      if ((pVVar33 == (bitmap_t)0x0) || (pVVar33->varr == (bitmap_el_t *)0x0)) goto LAB_0015e6c3;
      pVVar33->els_num = 0;
      for (peVar51 = (pbVar44->out_edges).head; peVar51 != (out_edge_t)0x0;
          peVar51 = (peVar51->out_link).next) {
        peVar51->flag1 = '\0';
        peVar51->flag2 = '\0';
      }
    }
    uVar25 = 0xffffffffffffffff;
    pgStack_108 = pgVar69;
    do {
      uVar25 = uVar25 + 1;
      pgVar73 = pgStack_108;
      if (pVVar35->els_num <= uVar25) goto LAB_0015d388;
      if (*(char *)((long)&pgVar69->ctx + 5) == '\0') {
        auStack_1a4._92_8_ = 0x15e71d;
        __assert_fail("spill_els_addr[i].edge_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x209a,"void transform_edge_to_bb_placement(gen_ctx_t)");
      }
      plVar12 = *(long **)&pgVar69->optimize_level;
      bVar91 = true;
      if ((*(char *)((long)&pgVar69->ctx + 4) == '\0') &&
         (((iVar57 = (int)*(undefined8 *)(**(long **)(*plVar12 + 0x58) + 0x18),
           0xffffffd0 < iVar57 - 0xa5U || (iVar57 == 0xaa)) || (iVar57 == 0xa6)))) {
        bVar91 = iVar57 == 0x76;
      }
      *(bool *)((long)plVar12 + 0x32) = bVar91;
      *(undefined1 *)((long)plVar12 + 0x33) = 1;
      pVVar33 = *(bitmap_t *)(*plVar12 + 0x80);
      uVar63 = *(uint *)&pgVar69->ctx;
      auStack_1a4._92_8_ = 0x15d301;
      bitmap_expand(pVVar33,(ulong)uVar63 + 1);
      if (pVVar33 == (bitmap_t)0x0) {
        auStack_1a4._92_8_ = 0x15e722;
        reg_alloc_cold_67();
LAB_0015e722:
        auStack_1a4._92_8_ = 0x15e727;
        reg_alloc_cold_66();
        goto LAB_0015e727;
      }
      pVVar33->varr[uVar63 >> 6] = pVVar33->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
      pVVar33 = *(bitmap_t *)(plVar12[1] + 0x78);
      uVar63 = *(uint *)&pgVar69->ctx;
      auStack_1a4._92_8_ = 0x15d342;
      bitmap_expand(pVVar33,(ulong)uVar63 + 1);
      pgVar73 = pgStack_108;
      if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e722;
      pgVar69 = (gen_ctx_t)&pgVar69->curr_func_item;
      pVVar33->varr[uVar63 >> 6] = pVVar33->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
      pVVar35 = pgStack_110->ra_ctx->spill_els;
      pgVar72 = pgStack_110;
    } while (pVVar35 != (VARR_spill_el_t *)0x0);
    auStack_1a4._92_8_ = 0x15d388;
    reg_alloc_cold_65();
LAB_0015d388:
    pVVar35 = pgVar72->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      uVar25 = 0;
      do {
        uVar65 = pVVar35->els_num;
        if (uVar65 <= uVar25) goto LAB_0015d615;
        if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0)) goto LAB_0015e695;
        plVar12 = *(long **)((long)&pgVar73->optimize_level + uVar25 * 2 * 8);
        pVVar45->els_num = 0;
        pVVar35 = pgVar72->ra_ctx->spill_els;
        while( true ) {
          if (pVVar35 == (VARR_spill_el_t *)0x0) {
            auStack_1a4._92_8_ = 0x15e644;
            reg_alloc_cold_62();
            goto LAB_0015e644;
          }
          if ((pVVar35->els_num <= uVar25) ||
             (plVar12 != *(long **)((long)&pgVar73->optimize_level + uVar25 * 2 * 8))) break;
          uVar63 = *(uint *)(pgVar73->call_used_hard_regs + uVar25 * 2 + -0xd);
          uVar65 = (ulong)uVar63 + 0x40 >> 6;
          lVar84 = uVar65 - pVVar45->els_num;
          if (pVVar45->els_num <= uVar65 && lVar84 != 0) {
            do {
              if (pVVar45->varr == (bitmap_el_t *)0x0) goto LAB_0015e544;
              uVar65 = pVVar45->els_num + 1;
              if (pVVar45->size < uVar65) {
                sVar87 = (uVar65 >> 1) + uVar65;
                auStack_1a4._92_8_ = 0x15d448;
                pbVar36 = (bitmap_el_t *)realloc(pVVar45->varr,sVar87 * 8);
                pVVar45->varr = pbVar36;
                pVVar45->size = sVar87;
                pgVar72 = pgStack_110;
              }
              sVar87 = pVVar45->els_num;
              pVVar45->els_num = sVar87 + 1;
              pVVar45->varr[sVar87] = 0;
              lVar84 = lVar84 + -1;
            } while (lVar84 != 0);
          }
          pVVar45->varr[uVar63 >> 6] = pVVar45->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
          uVar25 = uVar25 + 1;
          pVVar35 = pgVar72->ra_ctx->spill_els;
          pgVar73 = pgStack_108;
        }
        if (*(char *)((long)plVar12 + 0x32) != '\0') {
          lVar84 = *(long *)(*plVar12 + 0x40);
          for (lVar83 = lVar84; lVar83 != 0; lVar83 = *(long *)(lVar83 + 0x28)) {
            if (*(char *)(lVar83 + 0x32) == '\0') goto LAB_0015d553;
          }
          pVVar33 = *(bitmap_t *)(*plVar12 + 0x80);
          if (pVVar33 != (bitmap_t)0x0) {
            peVar79 = (in_edge_t)pVVar45->els_num;
            peStack_f8 = (in_edge_t)pVVar33->els_num;
            pVVar37 = pVVar45;
            peVar62 = peVar79;
            if (peStack_f8 < peVar79) {
              pVVar37 = pVVar33;
              pVVar33 = pVVar45;
              peVar62 = peStack_f8;
              peStack_f8 = peVar79;
            }
            pbVar36 = pVVar33->varr;
            auStack_1a4._92_8_ = 0x15d524;
            iVar57 = bcmp(pVVar37->varr,pbVar36,(long)peVar62 * 8);
            pgVar72 = pgStack_110;
            if (iVar57 == 0) {
              if (peVar62 < peStack_f8) {
                do {
                  if (pbVar36[(long)peVar62] != 0) goto LAB_0015d553;
                  peVar62 = (in_edge_t)((long)&peVar62->src + 1);
                } while (peStack_f8 != peVar62);
              }
            }
            else {
LAB_0015d553:
              for (; lVar84 != 0; lVar84 = *(long *)(lVar84 + 0x28)) {
                *(undefined1 *)(lVar84 + 0x32) = 0;
              }
            }
            goto LAB_0015d558;
          }
          auStack_1a4._92_8_ = 0x15e796;
          reg_alloc_cold_59();
LAB_0015e796:
          auStack_1a4._92_8_ = 0x15e79b;
          reg_alloc_cold_60();
          goto LAB_0015e79b;
        }
LAB_0015d558:
        if (*(char *)((long)plVar12 + 0x33) != '\0') {
          lVar84 = *(long *)(plVar12[1] + 0x30);
          for (lVar83 = lVar84; lVar83 != 0; lVar83 = *(long *)(lVar83 + 0x18)) {
            if (*(char *)(lVar83 + 0x33) == '\0') goto LAB_0015d5ef;
          }
          pVVar33 = *(bitmap_t *)(plVar12[1] + 0x78);
          if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e796;
          uVar65 = pVVar45->els_num;
          uVar59 = pVVar33->els_num;
          pVVar37 = pVVar45;
          uVar66 = uVar65;
          if (uVar59 < uVar65) {
            pVVar37 = pVVar33;
            pVVar33 = pVVar45;
            uVar66 = uVar59;
            uVar59 = uVar65;
          }
          pbVar36 = pVVar33->varr;
          auStack_1a4._92_8_ = 0x15d5c5;
          iVar57 = bcmp(pVVar37->varr,pbVar36,uVar66 * 8);
          pgVar72 = pgStack_110;
          if (iVar57 == 0) {
            if (uVar66 < uVar59) {
              do {
                if (pbVar36[uVar66] != 0) goto LAB_0015d5ef;
                uVar66 = uVar66 + 1;
              } while (uVar59 != uVar66);
            }
          }
          else {
LAB_0015d5ef:
            for (; lVar84 != 0; lVar84 = *(long *)(lVar84 + 0x18)) {
              *(undefined1 *)(lVar84 + 0x33) = 0;
            }
          }
        }
        pVVar35 = pgVar72->ra_ctx->spill_els;
        pgVar73 = pgStack_108;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    auStack_1a4._92_8_ = 0x15d615;
    reg_alloc_cold_64();
    uVar65 = extraout_RAX;
LAB_0015d615:
    if (uVar65 != 0) {
      psVar50 = (size_t *)&pgVar73->optimize_level;
      do {
        plVar12 = (long *)*psVar50;
        if ((*(char *)((long)plVar12 + 0x32) != '\0') && (*(char *)((long)plVar12 + 0x33) != '\0'))
        {
          if (*(long *)(*plVar12 + 0x40) == *(long *)(*plVar12 + 0x48)) {
            *(undefined1 *)((long)plVar12 + 0x32) = 0;
          }
          else if (*(long *)(plVar12[1] + 0x30) == *(long *)(plVar12[1] + 0x38)) {
            *(undefined1 *)((long)plVar12 + 0x33) = 0;
          }
        }
        psVar50 = psVar50 + 2;
        uVar65 = uVar65 - 1;
      } while (uVar65 != 0);
    }
    pVVar35 = pgVar72->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      peStack_f8 = (in_edge_t)(ulong)pgVar72->curr_bb_index;
      uVar25 = 0;
      do {
        if (pVVar35->els_num <= uVar25) goto LAB_0015e268;
        if (((undefined1 *)((long)&pgVar73->ctx + 5))[uVar25 * 0x10] == '\0') {
LAB_0015e727:
          auStack_1a4._92_8_ = 0x15e749;
          __assert_fail("spill_els_addr[n].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20c3,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        ppVVar90 = pgVar73->call_used_hard_regs + uVar25 * 2 + -0xd;
        peVar79 = (in_edge_t)ppVVar90[1];
        *(undefined2 *)((long)ppVVar90 + 5) = 0;
        if (peVar79->flag1 == '\0') {
          if (peVar79->flag2 == '\0') {
            pbVar44 = peVar79->src;
            if ((in_edge_t)pbVar44->index < peStack_f8) {
              pbVar44 = peVar79->dst;
              if ((in_edge_t)pbVar44->index < peStack_f8) {
                pMStack_e0 = pgVar72->ctx;
                pbVar38 = peVar79->src;
                pbStack_100 = peVar79->dst;
                pbVar55 = (pbVar38->bb_insns).tail;
                pbVar46 = (pbStack_100->bb_insns).head;
                pbStack_d8 = (bb_t_conflict)pbVar55->insn;
                pbVar40 = (bb_t_conflict)pbVar46->insn;
                if (((FILE *)pgVar72->debug_file != (FILE *)0x0) && (3 < pgVar72->debug_level)) {
                  auStack_1a4._92_8_ = 0x15d754;
                  pbStack_f0 = pbVar40;
                  pbStack_c0 = pbVar55;
                  fprintf((FILE *)pgVar72->debug_file,"    Splitting bb%lu->bb%lu:\n",pbVar38->index
                          ,pbStack_100->index);
                  pbVar55 = pbStack_c0;
                  pgVar72 = pgStack_110;
                  pbVar40 = pbStack_f0;
                }
                pMVar11 = pMStack_e0;
                pbVar42 = pbStack_100;
                if (((pbVar38->out_edges).head == (pbVar38->out_edges).tail) ||
                   (peVar79->fall_through_p != '\0')) {
                  if (peVar79->fall_through_p == '\0') {
                    if ((pbVar38->in_edges).head == (pbVar38->in_edges).tail) goto LAB_0015e1d8;
                    iVar57 = (int)pbStack_d8->bfs;
                    if ((1 < iVar57 - 0xabU) && (iVar57 != 0x76)) {
                      auStack_1a4._92_8_ = 0x15e953;
                      pbStack_f0 = pbVar38;
                      __assert_fail("last_insn->code == MIR_JMP || last_insn->code == MIR_RET || last_insn->code == MIR_JRET"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x392,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    auStack_1a4._92_8_ = 0x15d8ca;
                    pbStack_f0 = pbVar38;
                    delete_bb_insn(pgVar72,pbVar55);
                  }
                  else {
                    auStack_1a4._92_8_ = 0x15d7ac;
                    pbStack_f0 = pbVar38;
                    pbVar38 = (bb_t_conflict)MIR_new_insn_arr(pMStack_e0,MIR_USE,0,(MIR_op_t *)0x0);
                    auStack_1a4._92_8_ = 0x15d7c5;
                    MIR_insert_insn_after
                              (pMStack_e0,pgVar72->curr_func_item,(MIR_insn_t_conflict)pbStack_d8,
                               (MIR_insn_t_conflict)pbVar38);
                    pbStack_d8 = pbVar38;
                  }
                  auStack_1a4._92_8_ = 0x15d8dc;
                  pbVar38 = create_bb(pgVar72,(MIR_insn_t)pbStack_d8);
                  auStack_1a4._92_8_ = 0x15d8ef;
                  insert_new_bb_after(pgVar72,pbStack_f0,pbVar38);
                  if (peVar79 == (in_edge_t)0x0) goto LAB_0015e8ab;
                  peVar62 = (peVar79->in_link).prev;
                  if (peVar62 == (in_edge_t)0x0) {
                    if ((pbStack_100->in_edges).head != peVar79) goto LAB_0015e8b5;
                    (pbStack_100->in_edges).head = (peVar79->in_link).next;
                  }
                  else {
                    (peVar62->in_link).next = (peVar79->in_link).next;
                  }
                  peVar13 = (peVar79->in_link).next;
                  if (peVar13 == (in_edge_t)0x0) {
                    if ((pbStack_100->in_edges).tail != peVar79) goto LAB_0015e8ba;
                    pDVar53 = (DLIST_LINK_in_edge_t *)&(pbStack_100->in_edges).tail;
                  }
                  else {
                    pDVar53 = &peVar13->in_link;
                  }
                  pDVar53->prev = peVar62;
                  (peVar79->in_link).prev = (in_edge_t)0x0;
                  (peVar79->in_link).next = (in_edge_t)0x0;
                  peVar79->dst = pbVar38;
                  peVar52 = (pbVar38->in_edges).tail;
                  if (peVar52 == (in_edge_t_conflict)0x0) {
                    if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e8bf;
                    pDVar54 = &pbVar38->in_edges;
                  }
                  else {
                    if ((peVar52->in_link).next != (in_edge_t)0x0) goto LAB_0015e8b0;
                    pDVar54 = (DLIST_in_edge_t *)&(peVar52->in_link).next;
                  }
                  pDVar54->head = peVar79;
                  (peVar79->in_link).next = (in_edge_t)0x0;
                  (peVar79->in_link).prev = peVar52;
                  (pbVar38->in_edges).tail = peVar79;
                  auStack_1a4._92_8_ = 0x15d9a9;
                  create_edge(pgStack_110,pbVar38,pbStack_100,(uint)peVar79->fall_through_p,1);
                  peVar79->fall_through_p = '\x01';
                  pgVar72 = pgStack_110;
                  if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) &&
                     (3 < pgStack_110->debug_level)) {
                    auStack_1a4._92_8_ = 0x15d9e4;
                    fprintf((FILE *)pgStack_110->debug_file,
                            "     creating fall through bb%lu after bb%lu, redirect the edge to it",
                            pbVar38->index,(void *)pbStack_f0->index);
                    auStack_1a4._92_8_ = 0x15da06;
                    fprintf((FILE *)pgStack_110->debug_file,", and create edge bb%lu->bb%lu:\n",
                            pbVar38->index,pbStack_100->index);
                    auStack_1a4._92_8_ = 0x15da25;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)pgStack_110->debug_file);
                    pbVar40 = pbStack_d8;
                    goto LAB_0015da2a;
                  }
                }
                else {
                  peVar62 = (pbStack_100->in_edges).head;
                  pDStack_b8 = (DLIST_LINK_in_edge_t *)&(pbStack_100->in_edges).tail;
                  iVar57 = (int)pbVar40->bfs;
                  if (peVar62 == (pbStack_100->in_edges).tail) {
                    if (iVar57 != 0xb4) goto LAB_0015e90f;
                    pbVar38 = pbStack_100;
                    if (pbVar46 == (pbStack_100->bb_insns).tail) goto LAB_0015e1d8;
                    auStack_1a4._92_8_ = 0x15daf3;
                    delete_bb_insn(pgVar72,pbVar46);
                    auStack_1a4._92_8_ = 0x15db05;
                    pbStack_f0 = pbVar40;
                    pbVar38 = create_bb(pgStack_110,(MIR_insn_t)pbVar40);
                    auStack_1a4._92_8_ = 0x15db23;
                    DLIST_bb_t_insert_before(&pgStack_110->curr_cfg->bbs,pbVar42,pbVar38);
                    uVar63 = pgStack_110->curr_bb_index;
                    pgStack_110->curr_bb_index = uVar63 + 1;
                    pbVar38->index = (ulong)uVar63;
                    if (peVar79 == (in_edge_t)0x0) {
                      auStack_1a4._92_8_ = 0x15e958;
                      reg_alloc_cold_52();
                      goto LAB_0015e958;
                    }
                    peVar62 = (peVar79->in_link).prev;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbStack_100->in_edges).head == peVar79) {
                        (pbStack_100->in_edges).head = (peVar79->in_link).next;
                        goto LAB_0015dc64;
                      }
LAB_0015e993:
                      auStack_1a4._92_8_ = 0x15e998;
                      reg_alloc_cold_48();
LAB_0015e998:
                      auStack_1a4._92_8_ = 0x15e99d;
                      reg_alloc_cold_49();
LAB_0015e99d:
                      auStack_1a4._92_8_ = 0x15e9a2;
                      reg_alloc_cold_51();
LAB_0015e9a2:
                      auStack_1a4._92_8_ = 0x15e9c1;
                      __assert_fail("!MIR_any_branch_code_p (tail_insn->code)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c5,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    (peVar62->in_link).next = (peVar79->in_link).next;
LAB_0015dc64:
                    peVar13 = (peVar79->in_link).next;
                    if (peVar13 == (in_edge_t)0x0) {
                      pDVar53 = pDStack_b8;
                      if (pDStack_b8->prev == peVar79) goto LAB_0015dc7f;
                      goto LAB_0015e998;
                    }
                    pDVar53 = &peVar13->in_link;
LAB_0015dc7f:
                    pDVar53->prev = peVar62;
                    (peVar79->in_link).prev = (in_edge_t)0x0;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    peVar79->dst = pbVar38;
                    peVar62 = (pbVar38->in_edges).tail;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e99d;
                      pDVar54 = &pbVar38->in_edges;
                    }
                    else {
                      if ((peVar62->in_link).next != (in_edge_t)0x0) {
                        auStack_1a4._92_8_ = 0x15e98e;
                        reg_alloc_cold_50();
LAB_0015e98e:
                        auStack_1a4._92_8_ = 0x15e993;
                        reg_alloc_cold_41();
                        goto LAB_0015e993;
                      }
                      pDVar54 = (DLIST_in_edge_t *)&(peVar62->in_link).next;
                    }
                    pDVar54->head = peVar79;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    (peVar79->in_link).prev = peVar62;
                    (pbVar38->in_edges).tail = peVar79;
                    auStack_1a4._92_8_ = 0x15dce4;
                    create_edge(pgStack_110,pbVar38,pbStack_100,1,1);
                    pbVar40 = pbStack_100;
                    pgVar72 = pgStack_110;
                    if (((FILE *)pgStack_110->debug_file == (FILE *)0x0) ||
                       (pgStack_110->debug_level < 4)) goto LAB_0015e1d8;
                    auStack_1a4._92_8_ = 0x15dd1b;
                    fprintf((FILE *)pgStack_110->debug_file,
                            "     creating bb%lu before bb%lu, redirect the edge to it",
                            pbVar38->index,pbStack_100->index);
                    auStack_1a4._92_8_ = 0x15dd39;
                    fprintf((FILE *)pgStack_110->debug_file,
                            ", and create fall-through edge bb%lu->bb%lu:\n",pbVar38->index,
                            pbVar40->index);
                    auStack_1a4._92_8_ = 0x15dd58;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)pgStack_110->debug_file);
                    pbVar40 = pbStack_f0;
LAB_0015da2a:
                    pbVar46 = (bb_insn_t_conflict)pbVar40->index;
                  }
                  else {
                    pbStack_f0 = pbVar40;
                    pbStack_c0 = pbVar55;
                    if (iVar57 != 0xb4) goto LAB_0015e8c4;
                    for (; peVar62 != (in_edge_t)0x0; peVar62 = (peVar62->in_link).next) {
                      if (peVar62->fall_through_p != '\0') {
                        if (peVar62->dst != pbStack_100) goto LAB_0015e967;
                        auStack_1a4._92_8_ = 0x15db94;
                        MIR_new_label_op(pMStack_e0,(MIR_label_t)pbVar40);
                        uStack_120 = arStack_b0[1].live;
                        uStack_118 = arStack_b0[1].regs_to_save;
                        auStack_1a4._100_8_ = arStack_b0[0].bb;
                        pVStack_138 = arStack_b0[0].live;
                        peStack_130 = (in_edge_t)arStack_b0[0].regs_to_save;
                        uStack_128 = arStack_b0[1].bb;
                        auStack_1a4._92_8_ = 0x15dbc3;
                        pMVar39 = MIR_new_insn(pMVar11,MIR_JMP);
                        pgVar72 = pgStack_110;
                        pMVar7 = ((peVar62->src->bb_insns).tail)->insn;
                        pMStack_d0 = pMVar39;
                        if (((peVar62->out_link).next == (out_edge_t)0x0) &&
                           ((peVar62->out_link).prev == (out_edge_t)0x0)) {
                          iVar57 = (int)*(undefined8 *)&pMVar7->field_0x18;
                          if (((0xffffffd0 < iVar57 - 0xa5U) || (iVar57 == 0xaa)) ||
                             (iVar57 == 0xa6)) goto LAB_0015e9a2;
                          auStack_1a4._92_8_ = 0x15e21c;
                          gen_add_insn_after(pgStack_110,pMVar7,pMVar39);
                          pgVar72 = pgStack_110;
                          peVar62->fall_through_p = '\0';
                          if (((FILE *)pgStack_110->debug_file == (FILE *)0x0) ||
                             (pgStack_110->debug_level < 4)) break;
                          sVar87 = peVar62->src->index;
                          auStack_1a4._92_8_ = 0x15e263;
                          fprintf((FILE *)pgStack_110->debug_file,
                                  "     Make edge bb%lu->bb%lu a non-fall through, add new insn at the of bb%lu "
                                  ,sVar87,peVar62->dst->index,sVar87);
                        }
                        else {
                          auStack_1a4._92_8_ = 0x15dbfc;
                          MIR_insert_insn_after(pMVar11,pgStack_110->curr_func_item,pMVar7,pMVar39);
                          auStack_1a4._92_8_ = 0x15dc07;
                          pbVar40 = create_bb(pgVar72,pMVar39);
                          pbVar38 = peVar62->src;
                          auStack_1a4._92_8_ = 0x15dc18;
                          pgVar69 = pgVar72;
                          insert_new_bb_after(pgVar72,pbVar38,pbVar40);
                          pgVar73 = pgStack_108;
                          pbVar44 = peVar62->dst;
                          peVar13 = (peVar62->in_link).prev;
                          if (peVar13 == (in_edge_t)0x0) {
                            if ((pbVar44->in_edges).head == peVar62) {
                              (pbVar44->in_edges).head = (peVar62->in_link).next;
                              goto LAB_0015dd83;
                            }
                            auStack_1a4._92_8_ = 0x15e9c6;
                            reg_alloc_cold_39();
LAB_0015e9c6:
                            auStack_1a4._92_8_ = 0x15e9cb;
                            reg_alloc_cold_40();
LAB_0015e9cb:
                            auStack_1a4._92_8_ = add_bb_insn_dead_vars;
                            reg_alloc_cold_42();
                            auStack_1a4._52_8_ = peVar62;
                            auStack_1a4._60_8_ = pgVar72;
                            auStack_1a4._68_8_ = peVar79;
                            auStack_1a4._76_8_ = pbVar40;
                            auStack_1a4._84_8_ = ppVVar90;
                            auStack_1a4._92_8_ = uVar25;
                            if (pgVar69->optimize_level == 0) {
LAB_0015ee99:
                              __assert_fail("gen_ctx->optimize_level > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                            ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
                            }
                            pbVar42 = (bb_t_conflict)malloc(0x18);
                            pbVar42->index = 0;
                            pbVar42->pre = 4;
                            pvVar43 = malloc(0x20);
                            pbVar42->rpost = (size_t)pvVar43;
                            pbVar40 = (pgVar69->curr_cfg->bbs).head;
                            if (pbVar40 != (bb_t_conflict)0x0) {
                              auStack_1a4._36_8_ = &pgVar69->free_dead_vars;
                              auStack_1a4._20_8_ = &(pgVar69->free_dead_vars).tail;
                              pbStack_1b8 = pbVar42;
                              do {
                                pbVar38 = (bb_t_conflict)pbVar40->out;
                                bitmap_copy((bitmap_t)pbVar42,(const_bitmap_t)pbVar38);
                                bb_insn = (bb_t_conflict)(pbVar40->bb_insns).tail;
                                auStack_1a4._12_8_ = pbVar40;
                                while (bb_insn != (bb_t_conflict)0x0) {
                                  auStack_1a4._28_8_ = (bb_insn->bb_link).prev;
                                  pbVar38 = bb_insn;
                                  clear_bb_insn_dead_vars(pgVar69,(bb_insn_t_conflict)bb_insn);
                                  pbStack_1c8 = (bb_t_conflict)bb_insn->index;
                                  uVar65 = (ulong)*(uint *)((long)&pbStack_1c8->bfs + 4);
                                  pDStack_1b0 = &pbStack_1c8->in_edges;
                                  sVar87 = 0;
                                  pbStack_1c0 = bb_insn;
LAB_0015ea9d:
                                  bVar91 = true;
                                  if (sVar87 < uVar65) {
                                    pDVar54 = pDStack_1b0 + sVar87 * 3;
                                    do {
                                      pbVar38 = pbStack_1c8;
                                      MIR_insn_op_mode(pgVar69->ctx,(MIR_insn_t_conflict)pbStack_1c8
                                                       ,sVar87,&iStack_1cc);
                                      pbVar42 = pbStack_1b8;
                                      if ((iStack_1cc != 0) &&
                                         (*(char *)&((DLIST_LINK_bb_t *)(pDVar54 + -1))->next !=
                                          '\v')) {
                                        if (*(char *)&((DLIST_LINK_bb_t *)(pDVar54 + -1))->next !=
                                            '\x02') {
                                          __assert_fail("op_ref->mode == MIR_OP_VAR",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                                  ,0x4ff,
                                                  "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                                                  );
                                        }
                                        uVar25 = (ulong)*(uint *)&pDVar54->head;
                                        sVar87 = sVar87 + 1;
                                        bVar91 = false;
                                        goto LAB_0015eb00;
                                      }
                                      sVar87 = sVar87 + 1;
                                      pDVar54 = pDVar54 + 3;
                                    } while (uVar65 != sVar87);
                                    bVar91 = true;
                                  }
LAB_0015eb00:
                                  if (!bVar91) {
                                    pbVar38 = (bb_t_conflict)(uVar25 & 0xffffffff);
                                    uVar63 = var_to_scan_var(pgVar69,(MIR_reg_t)uVar25);
                                    if ((-1 < (int)uVar63) && ((ulong)uVar63 < pbVar42->index << 6))
                                    {
                                      bVar15 = (byte)uVar63 & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost + (ulong)(uVar63 >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    goto LAB_0015ea9d;
                                  }
                                  if ((pgVar69->lr_ctx->scan_vars_num == 0) &&
                                     (0xfffffffc < (int)pbStack_1c8->bfs - 0xaaU)) {
                                    bitmap_and_compl((bitmap_t)pbVar42,(bitmap_t)pbVar42,
                                                     pgVar69->call_used_hard_regs[0x12]);
                                    pbVar38 = pbVar42;
                                  }
                                  pDStack_1b0 = (DLIST_in_edge_t *)
                                                (ulong)*(uint *)((long)&pbStack_1c8->bfs + 4);
                                  auStack_1a4._44_8_ = &pbStack_1c8->bb_link;
                                  auStack_1a4._4_8_ = &(pbStack_1c0->in_edges).tail;
                                  uVar59 = 0;
                                  uVar65 = 0;
LAB_0015eb9d:
                                  bVar91 = true;
                                  uVar66 = uVar65;
                                  if (uVar59 < pDStack_1b0) {
                                    do {
                                      pbVar38 = pbStack_1c8;
                                      MIR_insn_op_mode(pgVar69->ctx,(MIR_insn_t_conflict)pbStack_1c8
                                                       ,uVar59,&iStack_1cc);
                                      if ((iStack_1cc == 0) ||
                                         (uVar65 = uVar66,
                                         *(char *)&((DLIST_LINK_bb_t *)
                                                   (auStack_1a4._44_8_ + uVar59 * 3 * 0x10))->next
                                         == '\v')) {
                                        if (uVar66 < 2) {
                                          while (*(char *)&((DLIST_LINK_bb_t *)
                                                           (auStack_1a4._44_8_ + uVar59 * 3 * 0x10))
                                                           ->next == '\v') {
                                            pbVar38 = (bb_t_conflict)(ulong)(uVar66 != 0);
                                            uVar63 = *(uint *)((long)&((DLIST_LINK_bb_t *)
                                                                      (auStack_1a4._44_8_ +
                                                                      (uVar59 * 3 + 2) * 0x10))->
                                                                      prev + (long)pbVar38 * 4);
                                            uVar25 = (ulong)uVar63;
                                            if (uVar63 != 0xffffffff) goto LAB_0015ec2f;
                                            if (uVar66 != 0) goto LAB_0015ec1d;
                                            uVar66 = 1;
                                          }
                                          if (uVar66 != 1) {
                                            uVar65 = 0;
                                            if (*(char *)&((DLIST_LINK_bb_t *)
                                                          (auStack_1a4._44_8_ + uVar59 * 3 * 0x10))
                                                          ->next != '\x02') goto LAB_0015ec20;
                                            uVar25 = (ulong)*(uint *)&((DLIST_LINK_bb_t *)
                                                                      (auStack_1a4._44_8_ +
                                                                      (uVar59 * 3 + 1) * 0x10))->
                                                                      prev;
LAB_0015ec2f:
                                            uVar65 = uVar66 + 1;
                                            bVar91 = false;
                                            break;
                                          }
                                        }
LAB_0015ec1d:
                                        uVar65 = 0;
                                      }
LAB_0015ec20:
                                      uVar59 = uVar59 + 1;
                                      uVar66 = uVar65;
                                    } while ((DLIST_in_edge_t *)uVar59 != pDStack_1b0);
                                  }
                                  pbVar42 = pbStack_1b8;
                                  if (!bVar91) {
                                    MVar64 = (MIR_reg_t)uVar25;
                                    pbVar38 = (bb_t_conflict)(uVar25 & 0xffffffff);
                                    uVar63 = var_to_scan_var(pgVar69,MVar64);
                                    pbVar40 = pbStack_1b8;
                                    if (-1 < (int)uVar63) {
                                      bitmap_expand((bitmap_t)pbStack_1b8,(ulong)uVar63 + 1);
                                      uVar66 = *(ulong *)(pbVar40->rpost + (ulong)(uVar63 >> 6) * 8)
                                      ;
                                      pbVar38 = (bb_t_conflict)
                                                (uVar66 | 1L << ((ulong)uVar63 & 0x3f));
                                      *(bb_t_conflict *)(pbVar40->rpost + (ulong)(uVar63 >> 6) * 8)
                                           = pbVar38;
                                      if ((uVar66 >> ((ulong)uVar63 & 0x3f) & 1) == 0) {
                                        for (peVar79 = *(in_edge_t *)auStack_1a4._4_8_;
                                            peVar79 != (in_edge_t)0x0;
                                            peVar79 = (peVar79->in_link).prev) {
                                          if (*(MIR_reg_t *)&peVar79->src == MVar64)
                                          goto LAB_0015eb9d;
                                        }
                                        pbVar44 = (bb_t)*(dead_var_t_conflict *)auStack_1a4._36_8_;
                                        if (pbVar44 != (bb_t)0x0) {
                                          pbVar49 = (bb_t)pbVar44->pre;
                                          pDVar71 = (DLIST_dead_var_t *)&pbVar49->rpost;
                                          if (pbVar49 == (bb_t)0x0) {
                                            pDVar71 = (DLIST_dead_var_t *)auStack_1a4._36_8_;
                                          }
                                          pDVar71->head =
                                               (dead_var_t_conflict)
                                               ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev;
                                          peVar79 = ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev;
                                          if (peVar79 != (in_edge_t)0x0) {
                                            ppbVar56 = &peVar79->dst;
LAB_0015ed0b:
                                            pbVar38 = (bb_t_conflict)&pbVar44->pre;
                                            *ppbVar56 = pbVar49;
                                            *(size_t *)pbVar38 = 0;
                                            pbVar44->rpost = 0;
                                            goto LAB_0015ed1a;
                                          }
                                          ppbVar56 = (bb_t *)auStack_1a4._20_8_;
                                          if (*(bb_t *)auStack_1a4._20_8_ == pbVar44)
                                          goto LAB_0015ed0b;
LAB_0015ee94:
                                          add_bb_insn_dead_vars_cold_1();
                                          goto LAB_0015ee99;
                                        }
                                        pbVar44 = (bb_t)malloc(0x18);
                                        if (pbVar44 == (bb_t)0x0) goto LAB_0015ee80;
LAB_0015ed1a:
                                        *(MIR_reg_t *)&pbVar44->index = MVar64;
                                        pbVar49 = (bb_t)(pbStack_1c0->out_edges).head;
                                        if (pbVar49 == (bb_t)0x0) {
                                          pDVar53 = (DLIST_LINK_in_edge_t *)auStack_1a4._4_8_;
                                          if (*(in_edge_t *)auStack_1a4._4_8_ != (in_edge_t)0x0) {
                                            add_bb_insn_dead_vars_cold_3();
                                            goto LAB_0015ee94;
                                          }
                                        }
                                        else {
                                          if (((DLIST_LINK_in_edge_t *)&pbVar49->rpost)->prev !=
                                              (in_edge_t)0x0) {
                                            add_bb_insn_dead_vars_cold_2();
LAB_0015ee80:
                                            util_error(pgVar69,"no memory");
                                          }
                                          pDVar53 = (DLIST_LINK_in_edge_t *)&pbVar49->rpost;
                                        }
                                        pDVar53->prev = (in_edge_t)pbVar44;
                                        ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev =
                                             (in_edge_t)0x0;
                                        pbVar44->pre = (size_t)pbVar49;
                                        (pbStack_1c0->out_edges).head = (out_edge_t)pbVar44;
                                      }
                                    }
                                    goto LAB_0015eb9d;
                                  }
                                  bb_insn = (bb_t_conflict)auStack_1a4._28_8_;
                                  if (pgVar69->lr_ctx->scan_vars_num == 0) {
                                    pbVar38 = (bb_t_conflict)auStack_1a4;
                                    target_get_early_clobbered_hard_regs
                                              ((MIR_insn_t)pbStack_1c8,(MIR_reg_t *)pbVar38,
                                               &uStack_1a8);
                                    if (((ulong)(uint)auStack_1a4._0_4_ != 0xffffffff) &&
                                       ((ulong)(uint)auStack_1a4._0_4_ < pbVar42->index << 6)) {
                                      bVar15 = (byte)auStack_1a4._0_4_ & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost +
                                                        (ulong)((uint)auStack_1a4._0_4_ >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    if (((ulong)uStack_1a8 != 0xffffffff) &&
                                       ((ulong)uStack_1a8 < pbVar42->index << 6)) {
                                      bVar15 = (byte)uStack_1a8 & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost +
                                                        (ulong)(uStack_1a8 >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    bb_insn = (bb_t_conflict)auStack_1a4._28_8_;
                                    if (0xfffffffc < (int)pbStack_1c8->bfs - 0xaaU) {
                                      pbVar38 = pbVar42;
                                      bitmap_ior((bitmap_t)pbVar42,(bitmap_t)pbVar42,
                                                 (bitmap_t)(pbStack_1c0->out_edges).tail);
                                      bb_insn = (bb_t_conflict)auStack_1a4._28_8_;
                                    }
                                  }
                                }
                                pbVar40 = ((DLIST_LINK_bb_t *)(auStack_1a4._12_8_ + 0x20))->next;
                              } while (pbVar40 != (bb_t)0x0);
                            }
                            pgVar72 = (gen_ctx_t)pbVar42->rpost;
                            if (pgVar72 != (gen_ctx_t)0x0) {
                              free(pgVar72);
                              free(pbVar42);
                              return;
                            }
                            add_bb_insn_dead_vars_cold_4();
                            if (pgVar72->lr_ctx->scan_vars_num == 0) {
                              pMVar86 = (MIR_reg_t *)0x0;
                            }
                            else {
                              pVVar4 = pgVar72->lr_ctx->scan_var_to_var_map;
                              if (pVVar4 == (VARR_MIR_reg_t *)0x0) {
                                output_bb_live_info_cold_1();
                                pbVar40 = (bb_t_conflict)malloc(0xa8);
                                if (pbVar40 == (bb_t_conflict)0x0) {
                                  util_error(pgVar72,"no memory");
                                }
                                pbVar40->loop_node = (loop_node_t_conflict)0x0;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pbVar40->pre = 0;
                                pbVar40->rpost = 0;
                                pbVar40->bfs = 0;
                                auVar93 = ZEXT432(0) << 0x40;
                                (pbVar40->in_edges).head =
                                     (in_edge_t_conflict)SUB168(auVar93._0_16_,0);
                                (pbVar40->in_edges).tail =
                                     (in_edge_t_conflict)SUB168(auVar93._0_16_,8);
                                (pbVar40->out_edges).head = (out_edge_t)SUB168(auVar93._16_16_,0);
                                (pbVar40->out_edges).tail = (out_edge_t)SUB168(auVar93._16_16_,8);
                                *(undefined1 (*) [32])((long)&(pbVar40->out_edges).head + 3) =
                                     auVar93;
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->in = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->out = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->gen = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->kill = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->dom_in = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->dom_out = pVVar45;
                                pbVar40->max_int_pressure = 0;
                                pbVar40->max_fp_pressure = 0;
                                if (pbVar38 != (bb_t_conflict)0x0) {
                                  if (pgVar72->optimize_level == 0) {
                                    setup_insn_data(pgVar72,(MIR_insn_t)pbVar38,pbVar40);
                                  }
                                  else {
                                    pbVar46 = create_bb_insn(pgVar72,(MIR_insn_t)pbVar38,pbVar40);
                                    DLIST_bb_insn_t_append(&pbVar40->bb_insns,pbVar46);
                                  }
                                }
                                return;
                              }
                              pMVar86 = pVVar4->varr;
                            }
                            output_bb_border_live_info(pgVar72,pbVar38);
                            output_bitmap(pgVar72,"  live_gen:",pbVar38->gen,1,pMVar86);
                            output_bitmap(pgVar72,"  live_kill:",pbVar38->kill,1,pMVar86);
                            return;
                          }
                          (peVar13->in_link).next = (peVar62->in_link).next;
LAB_0015dd83:
                          peVar14 = (peVar62->in_link).next;
                          pgVar72 = pgStack_108;
                          pgVar69 = pgStack_110;
                          if (peVar14 == (in_edge_t)0x0) {
                            pbVar38 = (bb_t_conflict)0x0;
                            if ((pbVar44->in_edges).tail != peVar62) goto LAB_0015e9c6;
                            pbVar38 = (bb_t_conflict)&(pbVar44->in_edges).tail;
                          }
                          else {
                            pbVar38 = (bb_t_conflict)&peVar14->in_link;
                          }
                          pbVar38->index = (size_t)peVar13;
                          (peVar62->in_link).prev = (in_edge_t)0x0;
                          (peVar62->in_link).next = (in_edge_t)0x0;
                          peVar62->dst = pbVar40;
                          peVar52 = (pbVar40->in_edges).tail;
                          if (peVar52 == (in_edge_t_conflict)0x0) {
                            if ((pbVar40->in_edges).head != (in_edge_t_conflict)0x0)
                            goto LAB_0015e9cb;
                            pDVar54 = &pbVar40->in_edges;
                          }
                          else {
                            if ((peVar52->in_link).next != (in_edge_t)0x0) goto LAB_0015e98e;
                            pDVar54 = (DLIST_in_edge_t *)&(peVar52->in_link).next;
                          }
                          pDVar54->head = peVar62;
                          (peVar62->in_link).next = (in_edge_t)0x0;
                          (peVar62->in_link).prev = peVar52;
                          (pbVar40->in_edges).tail = peVar62;
                          auStack_1a4._92_8_ = 0x15de05;
                          create_edge(pgStack_110,pbVar40,pbStack_100,0,1);
                          pbVar38 = pbStack_100;
                          if (((FILE *)pgStack_110->debug_file == (FILE *)0x0) ||
                             (pgStack_110->debug_level < 4)) break;
                          auStack_1a4._100_8_ = pbVar40->index;
                          sVar87 = peVar62->src->index;
                          auStack_1a4._92_8_ = 0x15de44;
                          fprintf((FILE *)pgStack_110->debug_file,
                                  "     creating bb%lu after bb%lu, redirect edge bb%lu->bb%lu to bb%lu"
                                  ,auStack_1a4._100_8_,sVar87,sVar87,pbStack_100->index);
                          pgVar72 = pgStack_110;
                          auStack_1a4._92_8_ = 0x15de64;
                          fprintf((FILE *)pgStack_110->debug_file,
                                  ", and create jump edge bb%lu->bb%lu:\n",pbVar40->index,
                                  pbVar38->index);
                          auStack_1a4._92_8_ = 0x15de7e;
                          fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar72->debug_file);
                        }
                        auStack_1a4._92_8_ = 0x15de90;
                        print_bb_insn(pgVar72,(bb_insn_t_conflict)pMStack_d0->data,0);
                        break;
                      }
                      pbVar55 = (peVar62->src->bb_insns).tail;
                      if ((pbVar55 == (bb_insn_t)0x0) ||
                         (((iVar57 = (int)*(undefined8 *)&pbVar55->insn->field_0x18,
                           iVar57 - 0xa5U < 0xffffffd1 && (iVar57 != 0xa6)) && (iVar57 != 0xaa))))
                      goto LAB_0015e849;
                    }
                    pMVar11 = pMStack_e0;
                    auStack_1a4._92_8_ = 0x15dea3;
                    pMVar39 = MIR_new_label(pMStack_e0);
                    auStack_1a4._92_8_ = 0x15debf;
                    MIR_insert_insn_before
                              (pMVar11,pgStack_110->curr_func_item,(MIR_insn_t_conflict)pbStack_f0,
                               pMVar39);
                    auStack_1a4._92_8_ = 0x15ded1;
                    pMStack_d0 = pMVar39;
                    pbVar38 = create_bb(pgStack_110,pMVar39);
                    auStack_1a4._92_8_ = 0x15def1;
                    DLIST_bb_t_insert_before(&pgStack_110->curr_cfg->bbs,pbStack_100,pbVar38);
                    uVar63 = pgStack_110->curr_bb_index;
                    pgStack_110->curr_bb_index = uVar63 + 1;
                    pbVar38->index = (ulong)uVar63;
                    if (peVar79 == (in_edge_t)0x0) {
                      auStack_1a4._92_8_ = 0x15e8eb;
                      reg_alloc_cold_47();
                      goto LAB_0015e8eb;
                    }
                    peVar62 = (peVar79->in_link).prev;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbStack_100->in_edges).head == peVar79) {
                        (pbStack_100->in_edges).head = (peVar79->in_link).next;
                        goto LAB_0015df48;
                      }
LAB_0015e958:
                      auStack_1a4._92_8_ = 0x15e95d;
                      reg_alloc_cold_43();
LAB_0015e95d:
                      auStack_1a4._92_8_ = 0x15e962;
                      reg_alloc_cold_44();
LAB_0015e962:
                      auStack_1a4._92_8_ = 0x15e967;
                      reg_alloc_cold_46();
LAB_0015e967:
                      auStack_1a4._92_8_ = 0x15e989;
                      __assert_fail("e2->dst == dst",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c0,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    (peVar62->in_link).next = (peVar79->in_link).next;
LAB_0015df48:
                    peVar13 = (peVar79->in_link).next;
                    if (peVar13 == (in_edge_t)0x0) {
                      pDVar53 = pDStack_b8;
                      if (pDStack_b8->prev != peVar79) goto LAB_0015e95d;
                    }
                    else {
                      pDVar53 = &peVar13->in_link;
                    }
                    pDVar53->prev = peVar62;
                    (peVar79->in_link).prev = (in_edge_t)0x0;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    peVar79->dst = pbVar38;
                    peVar62 = (pbVar38->in_edges).tail;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e962;
                      pDVar54 = &pbVar38->in_edges;
                    }
                    else {
                      if ((peVar62->in_link).next != (in_edge_t)0x0) {
                        auStack_1a4._92_8_ = 0x15e90f;
                        reg_alloc_cold_45();
LAB_0015e90f:
                        auStack_1a4._92_8_ = 0x15e931;
                        __assert_fail("first_insn->code == MIR_LABEL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3a6,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pDVar54 = (DLIST_in_edge_t *)&(peVar62->in_link).next;
                    }
                    pDVar54->head = peVar79;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    (peVar79->in_link).prev = peVar62;
                    (pbVar38->in_edges).tail = peVar79;
                    auStack_1a4._92_8_ = 0x15dfc8;
                    create_edge(pgStack_110,pbVar38,pbStack_100,1,1);
                    pbVar40 = pbStack_100;
                    if (((FILE *)pgStack_110->debug_file != (FILE *)0x0) &&
                       (3 < pgStack_110->debug_level)) {
                      auStack_1a4._92_8_ = 0x15dffe;
                      fprintf((FILE *)pgStack_110->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              pbVar38->index,pbStack_100->index);
                      auStack_1a4._92_8_ = 0x15e01c;
                      fprintf((FILE *)pgStack_110->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",pbVar38->index,
                              pbVar40->index);
                      auStack_1a4._92_8_ = 0x15e03b;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)pgStack_110->debug_file);
                      auStack_1a4._92_8_ = 0x15e04f;
                      print_bb_insn(pgStack_110,(bb_insn_t_conflict)pMStack_d0->data,0);
                      auStack_1a4._92_8_ = 0x15e06e;
                      fwrite("       change src bb insn ",0x1a,1,(FILE *)pgStack_110->debug_file);
                      auStack_1a4._92_8_ = 0x15e082;
                      print_bb_insn(pgStack_110,pbStack_c0,0);
                    }
                    pbVar40 = pbStack_d8;
                    uVar65 = pbStack_d8->bfs;
                    if ((int)uVar65 == 0xaa) {
                      if (uVar65 >> 0x21 == 0) {
LAB_0015e86b:
                        auStack_1a4._92_8_ = 0x15e88a;
                        __assert_fail("i < last_insn->nops",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3ff,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      if (*(bb_t_conflict *)&pbStack_d8->call_p == pbStack_f0) {
                        uVar59 = 1;
                        bVar91 = true;
                      }
                      else {
                        uVar59 = 1;
                        ppVVar80 = &pbStack_d8->dom_out;
                        do {
                          if ((2 - (uVar65 >> 0x20)) + uVar59 == 1) goto LAB_0015e86b;
                          uVar59 = uVar59 + 1;
                          pbVar42 = (bb_t_conflict)*ppVVar80;
                          ppVVar80 = ppVVar80 + 6;
                        } while (pbVar42 != pbStack_f0);
                        bVar91 = uVar59 < uVar65 >> 0x20;
                      }
                      if (!bVar91) goto LAB_0015e86b;
                      auStack_1a4._92_8_ = 0x15e178;
                      MIR_new_label_op(pMStack_e0,pMStack_d0);
                      auVar19._16_8_ = iStack_70;
                      auVar19._0_16_ = auStack_80;
                      auVar19._24_8_ = pcStack_68;
                      piVar3 = (int64_t *)((long)&pbVar40->in_edges + uVar59 * 0x30);
                      *piVar3 = iStack_70;
                      piVar3[1] = (int64_t)pcStack_68;
                      piVar3[2] = (int64_t)peStack_60;
                      piVar3[3] = (int64_t)peStack_58;
                      *(undefined1 (*) [32])((MIR_op_t *)&pbVar40->bb_link + uVar59) = auVar19;
                    }
                    else {
                      if ((((MIR_op_t *)&pbStack_d8->bb_link)->field_0x8 != '\f') ||
                         ((bb_t_conflict)
                          ((anon_union_32_12_57d33f68_for_u *)&pbStack_d8->in_edges)->i !=
                          pbStack_f0)) {
LAB_0015e8eb:
                        auStack_1a4._92_8_ = 0x15e90a;
                        __assert_fail("last_insn->ops[0].mode == MIR_OP_LABEL && last_insn->ops[0].u.label == first_insn"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3fa,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pMVar75 = (MIR_op_t *)&pbStack_d8->bb_link;
                      auStack_1a4._92_8_ = 0x15e128;
                      MIR_new_label_op(pMStack_e0,pMStack_d0);
                      auVar93._16_8_ = iStack_70;
                      auVar93._0_16_ = auStack_80;
                      auVar93._24_8_ = pcStack_68;
                      ((anon_union_32_12_57d33f68_for_u *)&pbVar40->in_edges)->i = iStack_70;
                      (((anon_union_32_12_57d33f68_for_u *)&pbVar40->in_edges)->str).s = pcStack_68;
                      (pbVar40->out_edges).head = peStack_60;
                      (pbVar40->out_edges).tail = peStack_58;
                      *(undefined1 (*) [32])pMVar75 = auVar93;
                    }
                    pgVar72 = pgStack_110;
                    if (((FILE *)pgStack_110->debug_file == (FILE *)0x0) ||
                       (pgStack_110->debug_level < 4)) goto LAB_0015e1d8;
                    auStack_1a4._92_8_ = 0x15e1c6;
                    fwrite("         to insn ",0x11,1,(FILE *)pgStack_110->debug_file);
                    pbVar46 = pbStack_c0;
                  }
                  auStack_1a4._92_8_ = 0x15da39;
                  print_bb_insn(pgStack_110,pbVar46,0);
                  pgVar72 = pgStack_110;
                }
LAB_0015e1d8:
                ppVVar90[1] = (bitmap_t)pbVar38;
                goto LAB_0015d86e;
              }
              peVar51 = (pbVar44->out_edges).head;
              if (peVar51 == (out_edge_t)0x0) goto LAB_0015e7d1;
              lVar84 = 1;
              do {
                peVar51 = (peVar51->out_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar51 != (out_edge_t)0x0);
              if ((lVar84 != 0) ||
                 (peVar52 = (pbVar44->in_edges).head, peVar52 == (in_edge_t_conflict)0x0))
              goto LAB_0015e7d1;
              lVar84 = 1;
              do {
                peVar52 = (peVar52->in_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar52 != (in_edge_t)0x0);
              if (lVar84 != 0) goto LAB_0015e7d1;
            }
            else {
              peVar51 = (pbVar44->out_edges).head;
              if (peVar51 == (out_edge_t)0x0) {
LAB_0015e79b:
                auStack_1a4._92_8_ = 0x15e7bd;
                __assert_fail("(DLIST_out_edge_t_length (&(e->src->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->src->in_edges))) == 1"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x20ce,"void transform_edge_to_bb_placement(gen_ctx_t)");
              }
              lVar84 = 1;
              do {
                peVar51 = (peVar51->out_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar51 != (out_edge_t)0x0);
              if ((lVar84 != 0) ||
                 (peVar52 = (pbVar44->in_edges).head, peVar52 == (in_edge_t_conflict)0x0))
              goto LAB_0015e79b;
              lVar84 = 1;
              do {
                peVar52 = (peVar52->in_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar52 != (in_edge_t)0x0);
              if (lVar84 != 0) goto LAB_0015e79b;
            }
          }
          else {
            pbVar44 = peVar79->dst;
          }
          ppVVar90[1] = (bitmap_t)pbVar44;
        }
        else {
          ppVVar90[1] = (bitmap_t)peVar79->src;
          *(undefined1 *)((long)ppVVar90 + 6) = 1;
        }
LAB_0015d86e:
        uVar25 = uVar25 + 1;
        pVVar35 = pgVar72->ra_ctx->spill_els;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    goto LAB_0015e6d7;
  }
LAB_0015e268:
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e894;
  auStack_1a4._92_8_ = 0x15e29e;
  qsort(pVStack_c8,pVVar35->els_num,0x10,spill_el_sort_cmp);
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e89c;
  sVar87 = pVVar35->els_num;
  if (sVar87 == 0) {
LAB_0015e345:
    pVVar35 = pgVar72->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      psVar34 = pVVar35->varr;
      if (((FILE *)pgVar72->debug_file != (FILE *)0x0) && (1 < pgVar72->debug_level)) {
        auStack_1a4._92_8_ = 0x15e38e;
        fwrite("+++++++++++++MIR after splitting edges:\n",0x28,1,(FILE *)pgVar72->debug_file);
        auStack_1a4._92_8_ = 0x15e3aa;
        print_CFG(pgStack_110,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
        auStack_1a4._92_8_ = 0x15e3c9;
        fwrite("  Spills on BBs:\n",0x11,1,(FILE *)pgStack_110->debug_file);
        pVVar35 = pgStack_110->ra_ctx->spill_els;
        if (pVVar35 != (VARR_spill_el_t *)0x0) {
          uVar25 = 0xffffffffffffffff;
          paVar41 = &psVar34->u;
          do {
            uVar25 = uVar25 + 1;
            pgVar72 = pgStack_110;
            if (pVVar35->els_num <= uVar25) goto LAB_0015e473;
            if (*(char *)((long)paVar41 + -3) != '\0') {
              auStack_1a4._92_8_ = 0x15e791;
              __assert_fail("!spill_els_addr[i].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x2103,"void split(gen_ctx_t)");
            }
            pcVar85 = "spill";
            if (*(char *)((long)paVar41 + -4) == '\0') {
              pcVar85 = "restore";
            }
            pcVar89 = "end";
            if (*(char *)((long)paVar41 + -2) == '\0') {
              pcVar89 = "start";
            }
            auStack_1a4._92_8_ = 0x15e453;
            fprintf((FILE *)pgStack_110->debug_file,"    %s r%d on %s of bb%lu\n",pcVar85,
                    (ulong)((spill_el_t *)(paVar41 + -1))->reg,pcVar89,paVar41->e->src);
            pVVar35 = pgStack_110->ra_ctx->spill_els;
            paVar41 = paVar41 + 2;
          } while (pVVar35 != (VARR_spill_el_t *)0x0);
        }
        auStack_1a4._92_8_ = 0x15e473;
        pgVar72 = pgStack_110;
        reg_alloc_cold_68();
      }
LAB_0015e473:
      pgVar69 = pgStack_110;
      pVVar35 = pgVar72->ra_ctx->spill_els;
      if (pVVar35 != (VARR_spill_el_t *)0x0) {
        paVar41 = &psVar34->u;
        uVar25 = 0xffffffffffffffff;
        do {
          uVar25 = uVar25 + 1;
          if (pVVar35->els_num <= uVar25) goto LAB_0015cad0;
          psVar34 = (spill_el_t *)(paVar41 + -1);
          if (psVar34->reg < 0x22) goto LAB_0015e69f;
          pcVar85 = (char *)((long)paVar41 + -4);
          if (*(char *)((long)paVar41 + -2) == '\0') {
            pbVar55 = (paVar41->bb->bb_insns).head;
            bVar91 = *(int *)&pbVar55->insn->field_0x18 == 0xb4;
          }
          else {
            pbVar55 = (paVar41->bb->bb_insns).tail;
            iVar57 = *(int *)&pbVar55->insn->field_0x18;
            bVar91 = (iVar57 - 0xa6U & 0xfffffffb) != 0 && iVar57 - 0xa5U < 0xffffffd1;
          }
          paVar41 = paVar41 + 2;
          auStack_1a4._92_8_ = 0x15e51b;
          spill_restore_reg(pgVar69,psVar34->reg,MStack_e4,pbVar55->insn,(uint)bVar91,
                            (uint)(*pcVar85 == '\0'));
          pVVar35 = pgVar69->ra_ctx->spill_els;
          pgVar72 = pgVar69;
        } while (pVVar35 != (VARR_spill_el_t *)0x0);
      }
      auStack_1a4._92_8_ = 0x15e53a;
      reg_alloc_cold_69();
LAB_0015e53a:
      auStack_1a4._92_8_ = 0x15e53f;
      reg_alloc_cold_31();
LAB_0015e53f:
      auStack_1a4._92_8_ = 0x15e544;
      reg_alloc_cold_30();
LAB_0015e544:
      auStack_1a4._92_8_ = 0x15e549;
      reg_alloc_cold_61();
LAB_0015e549:
      auStack_1a4._92_8_ = 0x15e54e;
      reg_alloc_cold_27();
LAB_0015e54e:
      auStack_1a4._92_8_ = 0x15e56d;
      __assert_fail("nel > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x204d,"void collect_spill_els(gen_ctx_t)");
    }
    goto LAB_0015e8a1;
  }
  if (sVar87 != 1) {
    psVar34 = pVVar35->varr;
    lVar84 = sVar87 - 1;
    lVar83 = 0;
    psVar17 = psVar34;
    do {
      e2 = psVar17 + 1;
      auStack_1a4._92_8_ = 0x15e2ea;
      iVar57 = spill_el_cmp(psVar34 + lVar83,e2);
      if (iVar57 != 0) {
        lVar83 = lVar83 + 1;
        cVar21 = e2->spill_p;
        cVar22 = e2->edge_p;
        cVar23 = e2->bb_end_p;
        uVar24 = e2->field_0x7;
        aVar18 = psVar17[1].u;
        psVar17 = psVar34 + lVar83;
        psVar17->reg = e2->reg;
        psVar17->spill_p = cVar21;
        psVar17->edge_p = cVar22;
        psVar17->bb_end_p = cVar23;
        psVar17->field_0x7 = uVar24;
        psVar17->u = aVar18;
      }
      lVar84 = lVar84 + -1;
      psVar17 = e2;
    } while (lVar84 != 0);
    sVar87 = lVar83 + 1;
    pgVar72 = pgStack_110;
  }
  pVVar35 = pgVar72->ra_ctx->spill_els;
  if (((pVVar35 != (VARR_spill_el_t *)0x0) && (pVVar35->varr != (spill_el_t *)0x0)) &&
     (sVar87 <= pVVar35->els_num)) {
    pVVar35->els_num = sVar87;
    goto LAB_0015e345;
  }
  goto LAB_0015e83a;
LAB_0015e5e3:
  auStack_1a4._92_8_ = 0x15e5e8;
  reg_alloc_cold_14();
  peVar79 = peStack_f8;
LAB_0015e5e8:
  peStack_f8 = peVar79;
  auStack_1a4._92_8_ = 0x15e5ed;
  reg_alloc_cold_35();
LAB_0015e5ed:
  auStack_1a4._92_8_ = 0x15e5f2;
  reg_alloc_cold_22();
LAB_0015e5f2:
  auStack_1a4._92_8_ = 0x15e611;
  __assert_fail("nel > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2019,"void rewrite(gen_ctx_t)");
LAB_0015e616:
  peStack_f8 = peVar79;
  auStack_1a4._92_8_ = 0x15e61b;
  reg_alloc_cold_34();
LAB_0015e61b:
  auStack_1a4._92_8_ = 0x15e620;
  reg_alloc_cold_33();
LAB_0015e620:
  auStack_1a4._92_8_ = 0x15e63f;
  __assert_fail("bitmap_equal_p (live, bb->in)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2017,"void rewrite(gen_ctx_t)");
LAB_0015e6c3:
  auStack_1a4._92_8_ = 0x15e6c8;
  reg_alloc_cold_37();
LAB_0015e6c8:
  auStack_1a4._92_8_ = 0x15e6cd;
  reg_alloc_cold_38();
LAB_0015e6cd:
  auStack_1a4._92_8_ = 0x15e6d2;
  reg_alloc_cold_24();
LAB_0015e6d2:
  auStack_1a4._92_8_ = 0x15e6d7;
  reg_alloc_cold_23();
LAB_0015e6d7:
  auStack_1a4._92_8_ = 0x15e6df;
  reg_alloc_cold_58();
LAB_0015e6df:
  auStack_1a4._92_8_ = 0x15e6fe;
  __assert_fail("(DLIST_bb_insn_t_head (&(bb->bb_insns))) != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2041,"void collect_spill_els(gen_ctx_t)");
LAB_0015ca57:
  if (((FILE *)pgVar72->debug_file != (FILE *)0x0) && (0 < pgVar72->debug_level)) {
    auVar92 = vcvtusi2sd_avx512f(auVar92,lVar84);
    dVar16 = auVar92._0_8_ * 100.0;
    auVar92 = vcvtusi2sd_avx512f(auVar94,pbVar38);
    auVar94 = vcvtusi2sd_avx512f(auVar94,lVar83);
    auStack_1a4._92_8_ = 0x15caa0;
    fprintf((FILE *)pgVar72->debug_file,
            "%5lu deleted RA noop moves out of %lu all moves (%.1f%%), out of %lu all insns (%.1f%%)\n"
            ,dVar16 / auVar92._0_8_,dVar16 / auVar94._0_8_,lVar84,pbVar38);
    pgVar72 = pgStack_110;
  }
  uVar63 = (uint)pbStack_100;
  if (pMStack_e0 != (MIR_context_t)0x0) {
    auStack_1a4._92_8_ = 0x15cac2;
    bitmap_and_compl(pgVar72->func_used_hard_regs,pgVar72->func_used_hard_regs,(bitmap_t)pMStack_e0)
    ;
    pgVar72 = pgStack_110;
  }
  if (uVar63 < 2) {
LAB_0015cad0:
    plVar31 = pgVar72->lr_ctx;
    pVVar47 = plVar31->var_live_ranges;
    if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e830;
    sVar87 = pVVar47->els_num;
    if (sVar87 != 0) {
      pplVar26 = pVVar47->varr;
      if (pplVar26 == (live_range_t_conflict *)0x0) goto LAB_0015e844;
      sVar68 = 0;
      do {
        plVar76 = pplVar26[sVar68];
        if (plVar76 != (live_range_t_conflict)0x0) {
          plVar77 = plVar31->free_lr_list;
          do {
            plVar74 = plVar76;
            plVar76 = plVar74->next;
            if (plVar74->lr_bb != (lr_bb_t_conflict)0x0) {
              plVar61 = plVar31->free_lr_bb_list;
              plVar10 = plVar74->lr_bb;
              do {
                plVar81 = plVar10;
                plVar10 = plVar81->next;
                plVar81->next = plVar61;
                plVar61 = plVar81;
              } while (plVar10 != (lr_bb_t)0x0);
              plVar31->free_lr_bb_list = plVar81;
            }
            plVar74->next = plVar77;
            plVar77 = plVar74;
          } while (plVar76 != (live_range_t)0x0);
          plVar31->free_lr_list = plVar74;
        }
        sVar68 = sVar68 + 1;
      } while (sVar68 != sVar87);
    }
    if (pVVar47->varr != (live_range_t_conflict *)0x0) {
      pVVar47->els_num = 0;
      return;
    }
  }
  else {
    if (((FILE *)pgVar72->debug_file != (FILE *)0x0) && (1 < pgVar72->debug_level)) {
      auStack_1a4._92_8_ = 0x15cb94;
      fwrite("+++++++++++++Spill info:\n",0x19,1,(FILE *)pgVar72->debug_file);
      auStack_1a4._92_8_ = 0x15cbb1;
      print_CFG(pgStack_110,1,0,0,0,output_bb_spill_info);
      pgVar72 = pgStack_110;
    }
    MStack_e4 = 5 - (pgVar72->target_ctx->keep_fp_p == '\0');
    pVVar35 = pgVar72->ra_ctx->spill_els;
    if ((pVVar35 != (VARR_spill_el_t *)0x0) && (pVVar35->varr != (spill_el_t *)0x0)) {
      pVVar35->els_num = 0;
      pgVar69 = (gen_ctx_t)(pgVar72->curr_cfg->bbs).head;
      pgVar73 = pgStack_108;
      if (pgVar69 != (gen_ctx_t)0x0) {
        iVar57 = -1;
        do {
          pgVar69 = (gen_ctx_t)pgVar69->to_free;
          if (pgVar69 == (gen_ctx_t)0x0) break;
          bVar91 = iVar57 != 0;
          iVar57 = iVar57 + 1;
        } while (bVar91);
      }
      do {
        pgStack_108 = pgVar69;
        if (pgStack_108 == (gen_ctx_t)0x0) goto LAB_0015d0a5;
        if (((DLIST_bb_insn_t *)&pgStack_108->temp_bitmap)->head == (bb_insn_t)0x0)
        goto LAB_0015e6df;
        __stream = (FILE *)pgVar72->debug_file;
        if ((__stream != (FILE *)0x0) && (1 < pgVar72->debug_level)) {
          pMVar11 = pgStack_108->ctx;
          auStack_1a4._92_8_ = 0x15cc53;
          uVar63 = bb_loop_level((bb_t_conflict)pgStack_108);
          auStack_1a4._92_8_ = 0x15cc69;
          fprintf(__stream," Process BB%lu(level %d) for splitting\n",pMVar11,(ulong)uVar63);
          pgVar72 = pgStack_110;
        }
        unaff_R13 = (gen_ctx_t)((ulong)unaff_R13 & 0xff0000ffffffffff | 0x1010000000000);
        for (peVar51 = (out_edge_t)pgStack_108->insn_to_consider; peVar51 != (out_edge_t)0x0;
            peVar51 = (peVar51->out_link).prev) {
          auStack_1a4._92_8_ = 0x15ccaf;
          bitmap_and_compl(pgVar72->temp_bitmap,peVar51->dst->gen,
                           pgStack_108->call_used_hard_regs[2]);
          pVVar45 = pgStack_110->temp_bitmap;
          if (pVVar45 == (bitmap_t)0x0) {
            auStack_1a4._92_8_ = 0x15e616;
            reg_alloc_cold_28();
            peVar79 = peStack_f8;
            goto LAB_0015e616;
          }
          pgVar72 = pgStack_110;
          if (pVVar45->els_num != 0) {
            sVar87 = 0;
            do {
              if (pVVar45->varr[sVar87] != 0) {
                pcVar89 = (char *)0x0;
                peStack_f8 = peVar51;
                goto LAB_0015ccf8;
              }
              sVar87 = sVar87 + 1;
            } while (pVVar45->els_num != sVar87);
          }
LAB_0015ccde:
        }
        peVar62 = (in_edge_t)pgStack_108->tied_regs;
        peVar79 = peStack_f8;
        while (peStack_f8 = peVar62, peStack_f8 != (in_edge_t)0x0) {
          pVVar45 = pgVar72->temp_bitmap;
          if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0))
          goto LAB_0015e5e8;
          pVVar45->els_num = 0;
          pVVar45 = peStack_f8->src->gen;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e616;
          pgVar69 = pgStack_108;
          pcVar89 = (char *)0x0;
LAB_0015ce43:
          uVar65 = (ulong)pcVar89 >> 6;
          uVar25 = pVVar45->els_num;
          bVar91 = true;
          pcVar70 = pcVar89;
          if (uVar65 < uVar25) {
            pcVar70 = (char *)(uVar25 << 6);
LAB_0015ce60:
            if ((pVVar45->varr[uVar65] == 0) ||
               (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar89 & 0x3f), uVar59 == 0))
            goto LAB_0015ce73;
            uVar25 = uVar59 & 1;
            pcVar85 = pcVar89;
            while (uVar25 == 0) {
              pcVar85 = pcVar85 + 1;
              uVar25 = uVar59 & 2;
              uVar59 = uVar59 >> 1;
            }
            pcVar70 = pcVar85 + 1;
            bVar91 = false;
          }
LAB_0015cea7:
          if (!bVar91) {
            pVVar33 = pgVar69->call_used_hard_regs[2];
            if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e53a;
            pcVar89 = pcVar70;
            if (((char *)(pVVar33->els_num << 6) <= pcVar85) ||
               ((pVVar33->varr[(ulong)pcVar85 >> 6] >> ((ulong)pcVar85 & 0x3f) & 1) == 0)) {
              pVVar33 = pgVar69->call_used_hard_regs[0];
              if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e53f;
              if ((pcVar85 < (char *)(pVVar33->els_num << 6)) &&
                 ((pVVar33->varr[(ulong)pcVar85 >> 6] >> ((ulong)pcVar85 & 0x3f) & 1) != 0)) {
                pVVar33 = pgVar72->temp_bitmap;
                auStack_1a4._92_8_ = 0x15cf27;
                bitmap_expand(pVVar33,(size_t)(pcVar85 + 1));
                if (pVVar33 == (bitmap_t)0x0) {
                  auStack_1a4._92_8_ = 0x15e596;
                  reg_alloc_cold_29();
                  goto LAB_0015e596;
                }
                pVVar33->varr[(ulong)pcVar85 >> 6] =
                     pVVar33->varr[(ulong)pcVar85 >> 6] | 1L << ((ulong)pcVar85 & 0x3f);
                pgVar72 = pgStack_110;
                pgVar69 = pgStack_108;
              }
            }
            goto LAB_0015ce43;
          }
          pVVar45 = pgVar72->temp_bitmap;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e61b;
          peVar82 = peStack_f8;
          if (pVVar45->els_num != 0) {
            sVar87 = 0;
            do {
              if (pVVar45->varr[sVar87] != 0) {
                pcVar89 = (char *)0x0;
                goto LAB_0015cf9d;
              }
              sVar87 = sVar87 + 1;
            } while (pVVar45->els_num != sVar87);
          }
LAB_0015cf83:
          peVar79 = peStack_f8;
          peVar62 = (peVar82->in_link).prev;
        }
        pgVar69 = (gen_ctx_t)pgStack_108->to_free;
        pgVar73 = pgStack_108;
        peStack_f8 = peVar79;
      } while( true );
    }
LAB_0015e82b:
    auStack_1a4._92_8_ = 0x15e830;
    reg_alloc_cold_76();
LAB_0015e830:
    auStack_1a4._92_8_ = 0x15e835;
    reg_alloc_cold_79();
  }
  auStack_1a4._92_8_ = 0x15e83a;
  reg_alloc_cold_78();
LAB_0015e83a:
  auStack_1a4._92_8_ = 0x15e83f;
  reg_alloc_cold_71();
LAB_0015e83f:
  auStack_1a4._92_8_ = 0x15e844;
  reg_alloc_cold_16();
LAB_0015e844:
  auStack_1a4._92_8_ = 0x15e849;
  reg_alloc_cold_77();
LAB_0015e849:
  auStack_1a4._92_8_ = 0x15e86b;
  __assert_fail("(DLIST_bb_insn_t_tail (&(e2->src->bb_insns))) != ((void*)0) && MIR_any_branch_code_p ((DLIST_bb_insn_t_tail (&(e2->src->bb_insns)))->insn->code)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x3bd,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
}

Assistant:

static void output_bb_border_live_info (gen_ctx_t gen_ctx, bb_t bb) {
  MIR_reg_t *map = scan_vars_num == 0 ? NULL : VARR_ADDR (MIR_reg_t, scan_var_to_var_map);
  output_bitmap (gen_ctx, "  live_in:", bb->live_in, TRUE, map);
  output_bitmap (gen_ctx, "  live_out:", bb->live_out, TRUE, map);
}